

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  ImWchar IVar6;
  undefined2 uVar7;
  ImFont *pIVar8;
  ImFontConfig *pIVar9;
  stbtt_fontinfo *info;
  undefined8 *puVar10;
  char cVar11;
  char cVar16;
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [14];
  undefined1 auVar30 [16];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  stbtt__buf fontdict;
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [15];
  undefined1 auVar38 [13];
  undefined1 auVar39 [14];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  unkbyte10 Var44;
  uint6 uVar45;
  undefined1 auVar46 [14];
  undefined1 auVar47 [16];
  stbtt__active_edge **ppsVar48;
  ushort uVar49;
  ushort uVar50;
  short sVar51;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar58;
  uint uVar59;
  int iVar60;
  int iVar61;
  stbtt__active_edge *z_1;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar54;
  stbtt_uint32 sVar55;
  stbtt_uint32 sVar56;
  stbtt_uint32 sVar57;
  void *pvVar62;
  int extraout_var;
  int *piVar63;
  void *pvVar64;
  stbrp_context *ptr;
  stbrp_node *ptr_00;
  uchar *puVar65;
  void *pvVar66;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar67;
  stbtt__buf *psVar68;
  stbtt__active_edge *psVar69;
  bool bVar70;
  short sVar71;
  uint uVar72;
  uint uVar73;
  ImWchar *pIVar74;
  ushort *puVar75;
  long lVar76;
  int x;
  ulong uVar77;
  long lVar78;
  bool bVar79;
  int iVar80;
  stbtt__active_edge *z;
  ulong uVar81;
  undefined8 *puVar82;
  ImU32 bit_n;
  long lVar83;
  ImFontAtlas *atlas_00;
  uchar uVar84;
  stbtt__edge *psVar85;
  ulong uVar86;
  ulong uVar87;
  uint *puVar88;
  stbrp_node **ppsVar89;
  byte *pbVar90;
  stbtt__edge *psVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  ImU32 mask;
  uint uVar95;
  float fVar96;
  uint uVar97;
  long lVar98;
  ImFontConfig *pIVar99;
  stbtt_fontinfo *psVar100;
  byte *pbVar101;
  bool bVar102;
  byte bVar103;
  char cVar111;
  char cVar112;
  char cVar114;
  ushort uVar113;
  short sVar115;
  short sVar116;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar139;
  float fVar140;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar147;
  float fVar148;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  uint uVar149;
  float fVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar151;
  undefined4 uVar152;
  uint uVar159;
  float fVar160;
  uint uVar161;
  float fVar162;
  uint uVar163;
  float fVar164;
  undefined1 auVar157 [16];
  float fVar165;
  uint uVar170;
  uint uVar172;
  undefined1 auVar166 [16];
  float fVar171;
  float fVar173;
  uint uVar174;
  float fVar175;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined4 uVar176;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  stbtt__buf sVar191;
  ImU32 *it_end;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffafc [12];
  undefined4 in_stack_fffffffffffffb24;
  undefined1 local_4c8 [16];
  uint local_4b0;
  stbtt_uint32 local_4ac;
  undefined1 local_4a8 [16];
  ulong local_498;
  float local_48c;
  undefined1 local_488 [16];
  stbtt__edge *local_470;
  undefined8 local_468;
  int local_45c;
  undefined1 local_458 [16];
  void *local_440;
  ulong local_438;
  undefined8 local_430;
  int local_424;
  int local_420;
  float local_41c;
  undefined1 local_418 [8];
  void *pvStack_410;
  long local_408;
  void *pvStack_400;
  ulong local_3f8;
  stbtt__active_edge *local_3f0;
  ulong local_3e8;
  float local_3dc;
  long local_3d8;
  void *pvStack_3d0;
  stbtt_fontinfo *local_3c0;
  undefined8 *local_3b8;
  long local_3b0;
  long local_3a8;
  ImFontConfig *pIStack_3a0;
  ImFontConfig *local_398;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  uchar *local_388;
  ulong local_380;
  ulong local_378;
  uchar *local_370;
  float *local_368;
  int local_35c;
  uint local_358;
  uint local_354;
  float local_350;
  int local_34c;
  int local_348;
  int local_344;
  stbrp_context *local_340;
  long local_338;
  float *local_330;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [16];
  stbrp_node *local_300;
  ImFontConfig *local_2f8;
  long local_2f0;
  size_t local_2e8;
  size_t local_2e0;
  long local_2d8;
  short *local_2d0;
  long local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined6 uVar153;
  undefined8 uVar154;
  undefined1 auVar155 [12];
  undefined1 auVar156 [14];
  undefined1 auVar158 [16];
  undefined6 uVar177;
  undefined8 uVar178;
  undefined1 auVar179 [12];
  undefined1 auVar180 [14];
  undefined1 auVar184 [16];
  
  uVar154 = local_4c8._0_8_;
  local_488._8_8_ = local_488._0_8_;
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  local_408 = 0;
  pvStack_400 = (void *)0x0;
  local_3d8 = 0;
  pvStack_3d0 = (void *)0x0;
  uVar59 = (atlas->ConfigData).Size;
  if (0 < (long)(int)uVar59) {
    uVar81 = 8;
    if (8 < uVar59) {
      uVar81 = (ulong)uVar59;
    }
    pvStack_400 = ImGui::MemAlloc(uVar81 * 0x110);
    local_408 = uVar81 << 0x20;
  }
  pvVar66 = pvStack_400;
  local_488._0_8_ = (long)(int)uVar59;
  local_408 = CONCAT44(local_408._4_4_,uVar59);
  uVar59 = (atlas->Fonts).Size;
  if ((long)(int)uVar59 < 1) {
    pvVar62 = (void *)0x0;
  }
  else {
    uVar81 = 8;
    if (8 < uVar59) {
      uVar81 = (ulong)uVar59;
    }
    pvVar62 = ImGui::MemAlloc(uVar81 << 5);
    local_3d8 = uVar81 << 0x20;
    pvStack_3d0 = pvVar62;
  }
  local_3d8 = CONCAT44(local_3d8._4_4_,uVar59);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = local_4c8._0_8_;
  local_4c8 = auVar118 << 0x40;
  auVar118 = local_4c8;
  local_4c8._8_8_ = uVar154;
  memset(pvVar66,0,local_488._0_8_ * 0x110);
  memset(pvVar62,0,(long)(int)uVar59 << 5);
  local_4a8._8_8_ = atlas;
  if (0 < (atlas->ConfigData).Size) {
    lVar98 = 0;
    local_4c8 = auVar118;
    do {
      pIVar99 = ((ImVector<ImFontConfig> *)(local_4a8._8_8_ + 0x60))->Data + lVar98;
      lVar83 = lVar98 * 0x110;
      *(undefined4 *)((long)pvVar66 + lVar83 + 0xe0) = 0xffffffff;
      uVar81 = (ulong)((ImVector<ImFont_*> *)(local_4a8._8_8_ + 0x40))->Size;
      if ((long)uVar81 < 1) {
LAB_001f2dd8:
        bVar102 = false;
        goto LAB_001f2da0;
      }
      uVar77 = 0;
      while (pIVar8 = ((ImVector<ImFont_*> *)(local_4a8._8_8_ + 0x40))->Data[uVar77],
            pIVar99->DstFont != pIVar8) {
        uVar77 = uVar77 + 1;
        bVar102 = false;
        if ((uVar81 <= uVar77) || (pIVar99->DstFont == pIVar8)) goto LAB_001f2da0;
      }
      *(int *)((long)pvVar66 + lVar83 + 0xe0) = (int)uVar77;
      pbVar101 = (byte *)pIVar99->FontData;
      iVar80 = pIVar99->FontNo;
      bVar103 = *pbVar101;
      sVar58 = 0xffffffff;
      local_458._0_8_ = lVar98;
      if (bVar103 < 0x4f) {
        if (bVar103 == 0) {
          if (pbVar101[1] == 1) goto LAB_001efb99;
        }
        else if ((bVar103 == 0x31) && (pbVar101[1] == 0)) {
LAB_001efb99:
          if ((pbVar101[2] == 0) && (pbVar101[3] == 0)) {
LAB_001efc05:
            sVar58 = -(uint)(iVar80 != 0);
          }
        }
      }
      else if (bVar103 == 0x4f) {
        if (((pbVar101[1] == 0x54) && (pbVar101[2] == 0x54)) && (pbVar101[3] == 0x4f))
        goto LAB_001efc05;
      }
      else if (bVar103 == 0x74) {
        bVar103 = pbVar101[1];
        if (bVar103 == 0x72) {
          if ((pbVar101[2] == 0x75) && (pbVar101[3] == 0x65)) goto LAB_001efc05;
        }
        else if (bVar103 == 0x74) {
          if ((pbVar101[2] == 99) && (pbVar101[3] == 0x66)) {
            uVar59 = *(uint *)(pbVar101 + 4);
            uVar59 = uVar59 >> 0x18 | (uVar59 & 0xff0000) >> 8 | (uVar59 & 0xff00) << 8 |
                     uVar59 << 0x18;
            if (((uVar59 == 0x20000) || (uVar59 == 0x10000)) &&
               (uVar59 = *(uint *)(pbVar101 + 8),
               iVar80 < (int)(uVar59 >> 0x18 | (uVar59 & 0xff0000) >> 8 | (uVar59 & 0xff00) << 8 |
                             uVar59 << 0x18))) {
              uVar59 = *(uint *)(pbVar101 + (long)iVar80 * 4 + 0xc);
              sVar58 = uVar59 >> 0x18 | (uVar59 & 0xff0000) >> 8 | (uVar59 & 0xff00) << 8 |
                       uVar59 << 0x18;
            }
          }
        }
        else if (((bVar103 == 0x79) && (pbVar101[2] == 0x70)) && (pbVar101[3] == 0x31))
        goto LAB_001efc05;
      }
      *(byte **)((long)pvVar66 + lVar83 + 8) = pbVar101;
      *(stbtt_uint32 *)((long)pvVar66 + lVar83 + 0x10) = sVar58;
      *(undefined8 *)((long)pvVar66 + lVar83 + 0x40) = 0;
      *(undefined8 *)((long)pvVar66 + lVar83 + 0x48) = 0;
      local_398 = pIVar99;
      sVar52 = stbtt__find_table(pbVar101,sVar58,"cmap");
      iVar80 = extraout_var;
      local_48c = (float)stbtt__find_table(pbVar101,sVar58,"loca");
      *(float *)((long)pvVar66 + lVar83 + 0x18) = local_48c;
      sVar53 = stbtt__find_table(pbVar101,sVar58,"head");
      *(stbtt_uint32 *)((long)pvVar66 + lVar83 + 0x1c) = sVar53;
      sVar54 = stbtt__find_table(pbVar101,sVar58,"glyf");
      *(stbtt_uint32 *)((long)pvVar66 + lVar83 + 0x20) = sVar54;
      sVar55 = stbtt__find_table(pbVar101,sVar58,"hhea");
      *(stbtt_uint32 *)((long)pvVar66 + lVar83 + 0x24) = sVar55;
      sVar56 = stbtt__find_table(pbVar101,sVar58,"hmtx");
      *(stbtt_uint32 *)((long)pvVar66 + lVar83 + 0x28) = sVar56;
      sVar57 = stbtt__find_table(pbVar101,sVar58,"kern");
      *(stbtt_uint32 *)((long)pvVar66 + lVar83 + 0x2c) = sVar57;
      sVar57 = stbtt__find_table(pbVar101,sVar58,"GPOS");
      *(stbtt_uint32 *)((long)pvVar66 + lVar83 + 0x30) = sVar57;
      bVar102 = false;
      if (((sVar52 == 0) || (sVar53 == 0)) || ((sVar55 == 0 || (sVar56 == 0)))) goto LAB_001f2da0;
      local_468 = CONCAT44(local_468._4_4_,sVar53);
      if (sVar54 == 0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffff00000000;
        local_430._0_4_ = 0;
        local_4ac = 0;
        sVar53 = stbtt__find_table(pbVar101,sVar58,"CFF ");
        if (sVar53 != 0) {
          *(undefined8 *)((long)pvVar66 + lVar83 + 0x90) = 0;
          *(undefined8 *)((long)pvVar66 + lVar83 + 0x98) = 0;
          *(undefined8 *)((long)pvVar66 + lVar83 + 0x80) = 0;
          *(undefined8 *)((long)pvVar66 + lVar83 + 0x88) = 0;
          *(byte **)((long)pvVar66 + lVar83 + 0x40) = pbVar101 + sVar53;
          *(undefined8 *)((long)pvVar66 + lVar83 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)pvVar66 + lVar83 + 0x40);
          uVar154 = *(undefined8 *)((long)pvVar66 + lVar83 + 0x48);
          local_238[0].cursor = (int)uVar154;
          local_238[0].size = (int)((ulong)uVar154 >> 0x20);
          uVar59 = local_238[0].cursor + 2U;
          if (local_238[0].size < (int)(local_238[0].cursor + 2U)) {
            uVar59 = local_238[0].size;
          }
          if (local_238[0].cursor < -2) {
            uVar59 = local_238[0].size;
          }
          local_238[0].cursor = 0;
          if ((int)uVar59 < local_238[0].size) {
            local_238[0].cursor = (int)local_238[0].data[(int)uVar59];
          }
          if (local_238[0].size < local_238[0].cursor) {
            local_238[0].cursor = local_238[0].size;
          }
          stbtt__cff_get_index(local_238);
          sVar191 = stbtt__cff_get_index(local_238);
          _local_418 = stbtt__cff_index_get(sVar191,0);
          stbtt__cff_get_index(local_238);
          sVar191 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar66 + lVar83 + 0x60) = sVar191;
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x11,1,(stbtt_uint32 *)local_4a8);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x106,1,(stbtt_uint32 *)&local_3a8);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x124,1,(stbtt_uint32 *)&local_430);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x125,1,&local_4ac);
          uVar154 = local_238[0]._8_8_;
          sVar191._4_12_ = in_stack_fffffffffffffafc;
          sVar191.data._0_4_ = in_stack_fffffffffffffaf8;
          fontdict.data._4_4_ = in_stack_fffffffffffffb24;
          fontdict.data._0_4_ = sVar54;
          fontdict.cursor = sVar52;
          fontdict.size = iVar80;
          sVar191 = stbtt__get_subrs(sVar191,fontdict);
          sVar53 = local_4ac;
          *(stbtt__buf *)((long)pvVar66 + lVar83 + 0x70) = sVar191;
          if (((stbtt_uint32)local_3a8 == 2) && (uVar152 = local_4a8._0_4_, local_4a8._0_4_ != 0)) {
            sVar54 = SUB84(uVar154,4);
            if ((stbtt_uint32)local_430 != 0) {
              uVar81 = (ulong)local_4ac;
              if (uVar81 == 0) goto LAB_001f2dd8;
              sVar55 = (stbtt_uint32)local_430;
              if ((int)sVar54 < (int)(stbtt_uint32)local_430) {
                sVar55 = sVar54;
              }
              if ((int)(stbtt_uint32)local_430 < 0) {
                sVar55 = sVar54;
              }
              local_238[0].cursor = sVar55;
              sVar191 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar66 + lVar83 + 0x80) = sVar191;
              puVar65 = local_238[0].data + uVar81;
              lVar98 = (ulong)(local_238[0].size - sVar53) << 0x20;
              if ((int)(local_238[0].size - sVar53 | sVar53) < 0 || local_238[0].size < (int)sVar53)
              {
                puVar65 = (uchar *)0x0;
                lVar98 = 0;
              }
              *(uchar **)((long)pvVar66 + lVar83 + 0x90) = puVar65;
              *(long *)((long)pvVar66 + lVar83 + 0x98) = lVar98;
              sVar54 = local_238[0].size;
            }
            auVar132._8_8_ = 0;
            auVar132._0_8_ = local_4c8._8_8_;
            local_4c8 = auVar132 << 0x40;
            sVar53 = uVar152;
            if ((int)sVar54 < (int)uVar152) {
              sVar53 = sVar54;
            }
            if ((int)uVar152 < 0) {
              sVar53 = sVar54;
            }
            local_238[0].cursor = sVar53;
            sVar191 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar66 + lVar83 + 0x50) = sVar191;
            lVar98 = local_458._0_8_;
            goto LAB_001effca;
          }
        }
        goto LAB_001f2dd8;
      }
      lVar98 = local_458._0_8_;
      if (local_48c == 0.0) goto LAB_001f2dd8;
LAB_001effca:
      sVar58 = stbtt__find_table(pbVar101,sVar58,"maxp");
      if (sVar58 == 0) {
        uVar59 = 0xffff;
      }
      else {
        uVar59 = (uint)(ushort)(*(ushort *)(pbVar101 + (ulong)sVar58 + 4) << 8 |
                               *(ushort *)(pbVar101 + (ulong)sVar58 + 4) >> 8);
      }
      *(uint *)((long)pvVar66 + lVar83 + 0x14) = uVar59;
      uVar49 = *(ushort *)(pbVar101 + (ulong)sVar52 + 2) << 8 |
               *(ushort *)(pbVar101 + (ulong)sVar52 + 2) >> 8;
      *(undefined4 *)((long)pvVar66 + lVar83 + 0x34) = 0;
      iVar80 = 0;
      bVar102 = false;
      if (uVar49 == 0) goto LAB_001f2da0;
      uVar59 = sVar52 + 4;
      uVar81 = (ulong)uVar49;
      do {
        uVar49 = *(ushort *)(pbVar101 + uVar59) << 8 | *(ushort *)(pbVar101 + uVar59) >> 8;
        if ((uVar49 == 0) ||
           ((uVar49 == 3 &&
            ((uVar49 = *(ushort *)(pbVar101 + (ulong)uVar59 + 2) << 8 |
                       *(ushort *)(pbVar101 + (ulong)uVar59 + 2) >> 8, uVar49 == 10 || (uVar49 == 1)
             ))))) {
          uVar95 = *(uint *)(pbVar101 + (ulong)uVar59 + 4);
          iVar80 = (uVar95 >> 0x18 | (uVar95 & 0xff0000) >> 8 | (uVar95 & 0xff00) << 8 |
                   uVar95 << 0x18) + sVar52;
          *(int *)((long)pvVar66 + lVar83 + 0x34) = iVar80;
        }
        uVar59 = uVar59 + 8;
        uVar81 = uVar81 - 1;
      } while (uVar81 != 0);
      if (iVar80 == 0) goto LAB_001f2dd8;
      *(uint *)((long)pvVar66 + lVar83 + 0x38) =
           (uint)(ushort)(*(ushort *)(pbVar101 + (long)(int)(float)local_468 + 0x32) << 8 |
                         *(ushort *)(pbVar101 + (long)(int)(float)local_468 + 0x32) >> 8);
      pIVar74 = local_398->GlyphRanges;
      if (pIVar74 == (ImWchar *)0x0) {
        pIVar74 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar66 + lVar83 + 0xd8) = pIVar74;
      IVar6 = *pIVar74;
      while (IVar6 != 0) {
        uVar49 = pIVar74[1];
        if (uVar49 == 0) break;
        uVar59 = *(uint *)((long)pvVar66 + lVar83 + 0xe4);
        uVar95 = (uint)uVar49;
        if ((int)(uint)uVar49 < (int)uVar59) {
          uVar95 = uVar59;
        }
        *(uint *)((long)pvVar66 + lVar83 + 0xe4) = uVar95;
        IVar6 = pIVar74[2];
        pIVar74 = pIVar74 + 2;
      }
      piVar63 = (int *)((long)*(int *)((long)pvVar66 + lVar83 + 0xe0) * 0x20 + (long)pvVar62);
      *piVar63 = *piVar63 + 1;
      iVar80 = *(int *)((long)pvVar66 + lVar83 + 0xe4);
      if (iVar80 < piVar63[1]) {
        iVar80 = piVar63[1];
      }
      piVar63[1] = iVar80;
      lVar98 = lVar98 + 1;
    } while (lVar98 < ((ImVector<ImFontConfig> *)(local_4a8._8_8_ + 0x60))->Size);
  }
  local_4c8._0_8_ = 0;
  uVar81 = local_488._0_8_;
  if (local_488._0_4_ < 1) {
LAB_001f042c:
    local_468 = 0;
  }
  else {
    lVar98 = 0;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_4c8._8_8_;
    local_4c8 = auVar134 << 0x40;
    do {
      local_488._0_8_ = lVar98;
      lVar98 = lVar98 * 0x110;
      pvVar62 = (void *)((long)*(int *)((long)pvVar66 + lVar98 + 0xe0) * 0x20 + (long)pvStack_3d0);
      ImBitVector::Create((ImBitVector *)((long)pvVar66 + lVar98 + 0xf0),
                          *(int *)((long)pvVar66 + lVar98 + 0xe4) + 1);
      if (*(int *)((long)pvVar62 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar62 + 0x10),*(int *)((long)pvVar62 + 4) + 1);
      }
      puVar75 = *(ushort **)((long)pvVar66 + lVar98 + 0xd8);
      uVar49 = *puVar75;
      for (; (uVar49 != 0 && (uVar113 = puVar75[1], uVar113 != 0)); puVar75 = puVar75 + 2) {
        if (uVar49 <= uVar113) {
          uVar59 = (uint)uVar49;
          lVar83 = *(long *)((long)pvVar62 + 0x18);
          do {
            auVar118 = local_4c8;
            uVar95 = 1 << ((byte)uVar59 & 0x1f);
            if (((*(uint *)(lVar83 + (ulong)(uVar59 >> 5) * 4) >> (uVar59 & 0x1f) & 1) == 0) &&
               (iVar80 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar66 + lVar98 + 8),
                                    *(int *)((long)pvVar66 + lVar98 + 0x34)), iVar80 != 0)) {
              piVar63 = (int *)((long)pvVar66 + lVar98 + 0xe8);
              *piVar63 = *piVar63 + 1;
              *(int *)((long)pvVar62 + 8) = *(int *)((long)pvVar62 + 8) + 1;
              uVar81 = (ulong)((uVar59 >> 5) << 2);
              puVar88 = (uint *)(*(long *)((long)pvVar66 + lVar98 + 0xf8) + uVar81);
              *puVar88 = *puVar88 | uVar95;
              puVar88 = (uint *)(lVar83 + uVar81);
              *puVar88 = *puVar88 | uVar95;
              iVar80 = local_4c8._0_4_;
              local_4c8._4_4_ = 0;
              local_4c8._0_4_ = iVar80 + 1;
              local_4c8._8_8_ = auVar118._8_8_;
            }
            uVar59 = uVar59 + 1;
          } while (uVar113 + 1 != uVar59);
        }
        uVar49 = puVar75[2];
      }
      lVar98 = local_488._0_8_ + 1;
      uVar81 = (ulong)(int)local_408;
    } while (lVar98 < (long)uVar81);
    local_468 = CONCAT71((int7)((ulong)lVar98 >> 8),0 < (int)local_408);
    if ((int)local_408 < 1) goto LAB_001f042c;
    uVar77 = 0;
    do {
      lVar98 = uVar77 * 0x110;
      iVar80 = *(int *)((long)pvVar66 + lVar98 + 0xe8);
      if (*(int *)((long)pvVar66 + lVar98 + 0x104) < iVar80) {
        pvVar64 = ImGui::MemAlloc((long)iVar80 << 2);
        pvVar62 = *(void **)((long)pvVar66 + lVar98 + 0x108);
        if (pvVar62 != (void *)0x0) {
          memcpy(pvVar64,pvVar62,(long)*(int *)((long)pvVar66 + lVar98 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar66 + lVar98 + 0x108));
        }
        *(void **)((long)pvVar66 + lVar98 + 0x108) = pvVar64;
        *(int *)((long)pvVar66 + lVar98 + 0x104) = iVar80;
      }
      lVar83 = (long)*(int *)((long)pvVar66 + lVar98 + 0xf0);
      puVar88 = *(uint **)((long)pvVar66 + lVar98 + 0xf8);
      if (0 < lVar83) {
        local_458._0_8_ = uVar77;
        local_488._0_8_ = uVar81;
        puVar1 = puVar88 + lVar83;
        iVar80 = 0;
        do {
          uVar152 = SUB84(puVar88,0);
          uVar176 = (undefined4)((ulong)puVar88 >> 0x20);
          uVar59 = *puVar88;
          if (uVar59 != 0) {
            uVar95 = 0;
            do {
              if ((uVar59 >> (uVar95 & 0x1f) & 1) != 0) {
                iVar92 = *(int *)((long)pvVar66 + lVar98 + 0x100);
                if (iVar92 == *(int *)((long)pvVar66 + lVar98 + 0x104)) {
                  if (iVar92 == 0) {
                    iVar60 = 8;
                  }
                  else {
                    iVar60 = iVar92 / 2 + iVar92;
                  }
                  iVar61 = iVar92 + 1;
                  if (iVar92 + 1 < iVar60) {
                    iVar61 = iVar60;
                  }
                  pvVar62 = ImGui::MemAlloc((long)iVar61 << 2);
                  pvVar64 = *(void **)((long)pvVar66 + lVar98 + 0x108);
                  if (pvVar64 != (void *)0x0) {
                    memcpy(pvVar62,pvVar64,(long)*(int *)((long)pvVar66 + lVar98 + 0x100) << 2);
                    ImGui::MemFree(*(void **)((long)pvVar66 + lVar98 + 0x108));
                  }
                  *(void **)((long)pvVar66 + lVar98 + 0x108) = pvVar62;
                  *(int *)((long)pvVar66 + lVar98 + 0x104) = iVar61;
                  iVar92 = *(int *)((long)pvVar66 + lVar98 + 0x100);
                }
                else {
                  pvVar62 = *(void **)((long)pvVar66 + lVar98 + 0x108);
                }
                *(uint *)((long)pvVar62 + (long)iVar92 * 4) = iVar80 + uVar95;
                piVar63 = (int *)((long)pvVar66 + lVar98 + 0x100);
                *piVar63 = *piVar63 + 1;
              }
              uVar95 = uVar95 + 1;
            } while (uVar95 != 0x20);
          }
          puVar88 = (uint *)(CONCAT44(uVar176,uVar152) + 4);
          iVar80 = iVar80 + 0x20;
        } while (puVar88 < puVar1);
        puVar88 = *(uint **)((long)pvVar66 + lVar98 + 0xf8);
        uVar77 = local_458._0_8_;
        uVar81 = local_488._0_8_;
      }
      if (puVar88 != (uint *)0x0) {
        *(undefined8 *)((long)pvVar66 + lVar98 + 0xf0) = 0;
        ImGui::MemFree(puVar88);
        *(undefined8 *)((long)pvVar66 + lVar98 + 0xf8) = 0;
      }
      uVar77 = uVar77 + 1;
    } while (uVar77 < uVar81);
  }
  pvVar62 = pvStack_3d0;
  atlas_00 = (ImFontAtlas *)local_4a8._8_8_;
  local_488._0_8_ = uVar81;
  uVar81 = (ulong)(int)local_3d8;
  if ((long)uVar81 < 1) {
    if (pvStack_3d0 == (void *)0x0) goto LAB_001f04ab;
  }
  else {
    puVar82 = (undefined8 *)((long)pvStack_3d0 + 0x18);
    uVar77 = 0;
    do {
      if ((void *)*puVar82 != (void *)0x0) {
        puVar82[-1] = 0;
        ImGui::MemFree((void *)*puVar82);
        *puVar82 = 0;
      }
      uVar77 = uVar77 + 1;
      puVar82 = puVar82 + 4;
    } while (uVar77 < uVar81);
  }
  local_3d8 = 0;
  ImGui::MemFree(pvVar62);
  pvStack_3d0 = (void *)0x0;
LAB_001f04ab:
  _local_418 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pIStack_3a0 = (ImFontConfig *)0x0;
  uVar59 = (uint)local_4c8._0_8_;
  if ((int)uVar59 < 1) {
    local_418._0_4_ = uVar59;
    pvVar62 = (void *)0x0;
  }
  else {
    uVar81 = 8;
    if (8 < uVar59) {
      uVar81 = local_4c8._0_8_ & 0xffffffff;
    }
    pvVar62 = ImGui::MemAlloc(uVar81 << 4);
    pvStack_410 = pvVar62;
    local_418._4_4_ = (int)uVar81;
    uVar81 = 8;
    if (8 < uVar59) {
      uVar81 = local_4c8._0_8_ & 0xffffffff;
    }
    local_418._0_4_ = uVar59;
    pIStack_3a0 = (ImFontConfig *)ImGui::MemAlloc(uVar81 * 0x1c);
    local_3a8 = uVar81 << 0x20;
  }
  pIVar99 = pIStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar59);
  iVar80 = 0;
  memset(pvVar62,0,(long)(int)(uVar59 << 4));
  memset(pIVar99,0,(long)(int)(uVar59 * 0x1c));
  fVar117 = 0.0;
  if ((char)local_468 != '\0') {
    uVar77 = (ulong)(uint)local_488._0_4_;
    uVar81 = 0;
    iVar60 = 0;
    iVar92 = 0;
    uVar152 = SUB84(pvVar62,0);
    uVar176 = (undefined4)((ulong)pvVar62 >> 0x20);
    local_398 = pIVar99;
    do {
      iVar61 = *(int *)((long)pvVar66 + uVar81 * 0x110 + 0xe8);
      if (iVar61 != 0) {
        psVar100 = (stbtt_fontinfo *)(uVar81 * 0x110 + (long)pvVar66);
        *(void **)&psVar100[1].hmtx = (void *)((long)iVar60 * 0x10 + (long)pvVar62);
        *(char **)&psVar100[1].gpos = pIVar99->Name + (long)iVar92 * 0x1c + -0x56;
        pIVar9 = (atlas_00->ConfigData).Data;
        fVar117 = pIVar9[uVar81].SizePixels;
        *(float *)&psVar100[1].userdata = fVar117;
        *(undefined4 *)((long)&psVar100[1].userdata + 4) = 0;
        psVar100[1].data = *(uchar **)&psVar100[1].gsubrs.cursor;
        iVar93 = *(int *)&psVar100[1].gsubrs.data;
        psVar100[1].fontstart = iVar93;
        *(char **)&psVar100[1].loca = pIVar99->Name + (long)iVar92 * 0x1c + -0x56;
        *(char *)&psVar100[1].glyf = (char)pIVar9[uVar81].OversampleH;
        *(char *)((long)&psVar100[1].glyf + 1) = (char)pIVar9[uVar81].OversampleV;
        if (fVar117 <= 0.0) {
          fVar117 = -fVar117;
          uVar59 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                 *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar65 = psVar100->data;
          lVar98 = (long)psVar100->hhea;
          uVar59 = ((int)(short)((ushort)puVar65[lVar98 + 4] << 8) | (uint)puVar65[lVar98 + 5]) -
                   ((int)(short)((ushort)puVar65[lVar98 + 6] << 8) | (uint)puVar65[lVar98 + 7]);
        }
        fVar117 = fVar117 / (float)(int)uVar59;
        iVar60 = iVar60 + iVar61;
        iVar92 = iVar92 + iVar61;
        atlas_00 = (ImFontAtlas *)local_4a8._8_8_;
        if (0 < iVar93) {
          local_458._0_4_ = iVar92;
          iVar92 = *(int *)(local_4a8._8_8_ + 0x14);
          lVar98 = 6;
          lVar83 = 0;
          uVar87 = uVar81;
          do {
            iVar61 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar100->data,psVar100->index_map);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar100,iVar61,(float)pIVar9[uVar81].OversampleH * fVar117,
                       (float)pIVar9[uVar81].OversampleV * fVar117,fVar117,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_4a8,(int *)&local_430,(int *)&local_4ac);
            uVar59 = (pIVar9[uVar81].OversampleH +
                     (((stbtt_uint32)local_430 + iVar92) - (int)local_238[0].data)) - 1;
            lVar78 = *(long *)&psVar100[1].hmtx;
            *(short *)(lVar78 + -2 + lVar98) = (short)uVar59;
            uVar95 = (pIVar9[uVar81].OversampleV + ((local_4ac + iVar92) - local_4a8._0_4_)) - 1;
            *(short *)(lVar78 + lVar98) = (short)uVar95;
            iVar80 = iVar80 + (uVar95 & 0xffff) * (uVar59 & 0xffff);
            lVar83 = lVar83 + 1;
            lVar98 = lVar98 + 0x10;
          } while (lVar83 < *(int *)&psVar100[1].gsubrs.data);
          pvVar62 = (void *)CONCAT44(uVar176,uVar152);
          uVar81 = uVar87;
          atlas_00 = (ImFontAtlas *)local_4a8._8_8_;
          pIVar99 = local_398;
          iVar92 = local_458._0_4_;
        }
      }
      uVar81 = uVar81 + 1;
    } while (uVar81 < uVar77);
    fVar117 = (float)iVar80;
  }
  atlas_00->TexHeight = 0;
  iVar80 = atlas_00->TexDesiredWidth;
  if (iVar80 < 1) {
    iVar92 = (int)SQRT(fVar117);
    iVar80 = 0x1000;
    if ((iVar92 < 0xb33) && (iVar80 = 0x800, iVar92 < 0x599)) {
      iVar80 = (uint)(0x2cb < iVar92) * 0x200 + 0x200;
    }
  }
  atlas_00->TexWidth = iVar80;
  local_4b0 = atlas_00->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar59 = iVar80 - local_4b0;
  ptr_00 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar59 << 4);
  auVar132 = _DAT_002a3960;
  auVar118 = _DAT_0022f730;
  if ((ptr == (stbrp_context *)0x0) || (ptr_00 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (ptr_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    ptr_00 = (stbrp_node *)0x0;
    local_4b0 = 0;
    iVar80 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar81 = (ulong)(uVar59 - 1);
    if ((int)uVar59 < 2) {
      uVar81 = 0;
    }
    else {
      uVar77 = (ulong)(uVar59 & 0x7ffffffe);
      lVar98 = uVar81 - 1;
      auVar104._8_4_ = (int)lVar98;
      auVar104._0_8_ = lVar98;
      auVar104._12_4_ = (int)((ulong)lVar98 >> 0x20);
      ppsVar89 = &ptr_00[1].next;
      auVar104 = auVar104 ^ _DAT_0022f730;
      auVar129._8_4_ = 0xffffffff;
      auVar129._0_8_ = 0xffffffffffffffff;
      auVar129._12_4_ = 0xffffffff;
      auVar166 = _DAT_0022f810;
      do {
        auVar134 = auVar166 ^ auVar118;
        auVar143._0_4_ = -(uint)(auVar104._0_4_ < auVar134._0_4_);
        auVar143._4_4_ = -(uint)(auVar104._4_4_ < auVar134._4_4_);
        auVar143._8_4_ = -(uint)(auVar104._8_4_ < auVar134._8_4_);
        auVar143._12_4_ = -(uint)(auVar104._12_4_ < auVar134._12_4_);
        auVar135._4_4_ = -(uint)(auVar134._4_4_ == auVar104._4_4_);
        auVar135._12_4_ = -(uint)(auVar134._12_4_ == auVar104._12_4_);
        auVar135._0_4_ = auVar135._4_4_;
        auVar135._8_4_ = auVar135._12_4_;
        auVar144._4_4_ = auVar143._4_4_;
        auVar144._0_4_ = auVar143._4_4_;
        auVar144._8_4_ = auVar143._12_4_;
        auVar144._12_4_ = auVar143._12_4_;
        auVar144 = auVar144 | auVar135 & auVar143;
        lVar98 = auVar166._8_8_;
        if ((~auVar144._0_4_ & 1) != 0) {
          ppsVar89[-2] = ptr_00 + auVar166._0_8_ + 1;
        }
        if (((auVar144 ^ auVar129) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar89 = ptr_00 + (lVar98 - auVar129._8_8_);
        }
        auVar166._0_8_ = auVar166._0_8_ + auVar132._0_8_;
        auVar166._8_8_ = lVar98 + auVar132._8_8_;
        ppsVar89 = ppsVar89 + 4;
        uVar77 = uVar77 - 2;
      } while (uVar77 != 0);
    }
    ptr_00[uVar81].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = ptr_00;
    ptr->active_head = ptr->extra;
    ptr->width = uVar59;
    ptr->height = 0x8000 - local_4b0;
    ptr->num_nodes = uVar59;
    ptr->align = (int)((uVar59 - 1) + uVar59) / (int)uVar59;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar59;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_340 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr);
  if ((char)local_468 != '\0') {
    uVar81 = (ulong)(uint)local_488._0_4_;
    uVar77 = 0;
    do {
      lVar98 = uVar77 * 0x110;
      iVar92 = *(int *)((long)pvVar66 + lVar98 + 0xe8);
      if (iVar92 != 0) {
        stbrp_pack_rects(local_340,*(stbrp_rect **)((long)pvVar66 + lVar98 + 200),iVar92);
        lVar83 = (long)*(int *)((long)pvVar66 + lVar98 + 0xe8);
        if (0 < lVar83) {
          lVar98 = *(long *)((long)pvVar66 + lVar98 + 200);
          lVar78 = 0;
          do {
            if (*(int *)(lVar98 + 0xc + lVar78) != 0) {
              iVar92 = (uint)*(ushort *)(lVar98 + 6 + lVar78) +
                       (uint)*(ushort *)(lVar98 + 10 + lVar78);
              if (iVar92 < atlas_00->TexHeight) {
                iVar92 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar92;
            }
            lVar78 = lVar78 + 0x10;
          } while (lVar83 * 0x10 != lVar78);
        }
      }
      uVar77 = uVar77 + 1;
    } while (uVar77 < uVar81);
  }
  uVar59 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar59 = (int)(uVar59 - 1) >> 1 | uVar59 - 1;
    uVar59 = (int)uVar59 >> 2 | uVar59;
    uVar59 = (int)uVar59 >> 4 | uVar59;
    uVar59 = (int)uVar59 >> 8 | uVar59;
    uVar59 = (int)uVar59 >> 0x10 | uVar59;
  }
  iVar92 = uVar59 + 1;
  atlas_00->TexHeight = iVar92;
  auVar105._0_4_ = (float)atlas_00->TexWidth;
  auVar105._4_4_ = (float)iVar92;
  auVar105._8_8_ = 0;
  auVar118 = divps(_DAT_00245cd0,auVar105);
  atlas_00->TexUvScale = auVar118._0_8_;
  puVar65 = (uchar *)ImGui::MemAlloc((long)(iVar92 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar65;
  local_45c = iVar80;
  local_300 = ptr_00;
  memset(puVar65,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if ((char)local_468 != '\0') {
    local_388 = atlas_00->TexPixelsAlpha8;
    lVar83 = (long)local_45c;
    local_298 = pshuflw(ZEXT416(local_4b0),ZEXT416(local_4b0),0);
    lVar98 = 0;
    auVar134 = _DAT_0022f730;
    auVar132 = _DAT_002a98e0;
    auVar118 = _DAT_002a98c0;
    do {
      local_338 = lVar98;
      if (*(int *)((long)pvStack_400 + lVar98 * 0x110 + 0xe8) != 0) {
        psVar100 = (stbtt_fontinfo *)((long)pvStack_400 + lVar98 * 0x110);
        fVar117 = *(float *)&psVar100[1].userdata;
        if (fVar117 <= 0.0) {
          auVar125._4_4_ = auVar134._4_4_;
          auVar125._0_4_ = (uint)fVar117 ^ auVar134._0_4_;
          auVar125._8_4_ = auVar134._8_4_;
          auVar125._12_4_ = auVar134._12_4_;
          uVar59 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8 |
                                 *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >> 8);
        }
        else {
          puVar65 = psVar100->data;
          lVar98 = (long)psVar100->hhea;
          uVar59 = ((int)(short)((ushort)puVar65[lVar98 + 4] << 8) | (uint)puVar65[lVar98 + 5]) -
                   ((int)(short)((ushort)puVar65[lVar98 + 6] << 8) | (uint)puVar65[lVar98 + 7]);
          auVar125 = ZEXT416((uint)fVar117);
        }
        local_318._4_12_ = auVar125._4_12_;
        local_318._0_4_ = auVar125._0_4_ / (float)(int)uVar59;
        local_2f8 = (atlas_00->ConfigData).Data;
        iVar80 = psVar100[1].fontstart;
        if (0 < iVar80) {
          lVar98._0_4_ = psVar100[1].hmtx;
          lVar98._4_4_ = psVar100[1].kern;
          uVar81._0_4_ = psVar100[1].glyf;
          uVar81._4_4_ = psVar100[1].hhea;
          auVar24._8_6_ = 0;
          auVar24._0_8_ = uVar81;
          auVar24[0xe] = (char)((uint)uVar81._4_4_ >> 0x18);
          auVar26._8_4_ = 0;
          auVar26._0_8_ = uVar81;
          auVar26[0xc] = (char)((uint)uVar81._4_4_ >> 0x10);
          auVar26._13_2_ = auVar24._13_2_;
          auVar27._8_4_ = 0;
          auVar27._0_8_ = uVar81;
          auVar27._12_3_ = auVar26._12_3_;
          auVar28._8_2_ = 0;
          auVar28._0_8_ = uVar81;
          auVar28[10] = (char)((uint)uVar81._4_4_ >> 8);
          auVar28._11_4_ = auVar27._11_4_;
          auVar31._8_2_ = 0;
          auVar31._0_8_ = uVar81;
          auVar31._10_5_ = auVar28._10_5_;
          auVar32[8] = (char)uVar81._4_4_;
          auVar32._0_8_ = uVar81;
          auVar32._9_6_ = auVar31._9_6_;
          auVar35._7_8_ = 0;
          auVar35._0_7_ = auVar32._8_7_;
          cVar114 = (char)((uint)(undefined4)uVar81 >> 0x18);
          Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),cVar114);
          auVar43._9_6_ = 0;
          auVar43._0_9_ = Var36;
          cVar112 = (char)((uint)(undefined4)uVar81 >> 0x10);
          auVar33[4] = cVar112;
          auVar33._0_4_ = (undefined4)uVar81;
          auVar33._5_10_ = SUB1510(auVar43 << 0x30,5);
          auVar37._11_4_ = 0;
          auVar37._0_11_ = auVar33._4_11_;
          cVar111 = (char)((uint)(undefined4)uVar81 >> 8);
          auVar38._1_12_ = SUB1512(auVar37 << 0x20,3);
          auVar38[0] = cVar111;
          bVar103 = (byte)(undefined4)uVar81;
          uVar49 = CONCAT11(0,bVar103);
          auVar34._2_13_ = auVar38;
          auVar34._0_2_ = uVar49;
          uVar113 = auVar38._0_2_;
          sVar71 = -auVar33._4_2_;
          sVar115 = (short)Var36;
          sVar51 = -sVar115;
          local_498 = (ulong)uVar113;
          auVar25._10_2_ = 0;
          auVar25._0_10_ = auVar34._0_10_;
          auVar25._12_2_ = sVar115;
          uVar45 = CONCAT42(auVar25._10_4_,auVar33._4_2_);
          auVar39._6_8_ = 0;
          auVar39._0_6_ = uVar45;
          auVar29._4_2_ = uVar113;
          auVar29._0_4_ = auVar34._0_4_;
          auVar29._6_8_ = SUB148(auVar39 << 0x40,6);
          auVar106._0_4_ = (float)uVar49;
          auVar106._4_4_ = (float)auVar29._4_4_;
          auVar106._8_4_ = (float)(int)uVar45;
          auVar106._12_4_ = (float)(auVar25._10_4_ >> 0x10);
          local_268 = divps(_DAT_00245cd0,auVar106);
          auVar136[0] = -(bVar103 == 0);
          auVar136[1] = -(bVar103 == 0);
          auVar136[2] = -(bVar103 == 0);
          auVar136[3] = -(bVar103 == 0);
          auVar136[4] = -(cVar111 == '\0');
          auVar136[5] = -(cVar111 == '\0');
          auVar136[6] = -(cVar111 == '\0');
          auVar136[7] = -(cVar111 == '\0');
          auVar136[8] = -(cVar112 == '\0');
          auVar136[9] = -(cVar112 == '\0');
          auVar136[10] = -(cVar112 == '\0');
          auVar136[0xb] = -(cVar112 == '\0');
          auVar136[0xc] = -(cVar114 == '\0');
          auVar136[0xd] = -(cVar114 == '\0');
          auVar136[0xe] = -(cVar114 == '\0');
          auVar136[0xf] = -(cVar114 == '\0');
          Var44 = CONCAT64(CONCAT42(CONCAT22(sVar51,sVar51),sVar71),CONCAT22(sVar71,sVar51));
          auVar40._4_8_ = (long)((unkuint10)Var44 >> 0x10);
          auVar40._2_2_ = 1 - uVar113;
          auVar40._0_2_ = 1 - uVar113;
          auVar119._0_4_ = (float)(int)(short)(1 - uVar49);
          auVar119._4_4_ = (float)(auVar40._0_4_ >> 0x10);
          auVar119._8_4_ = (float)((int)((unkuint10)Var44 >> 0x10) >> 0x10);
          auVar119._12_4_ = (float)(int)sVar51;
          auVar130._0_4_ = (float)local_318._0_4_ * auVar106._0_4_;
          auVar130._4_4_ = (float)local_318._0_4_ * auVar106._4_4_;
          auVar130._8_4_ = (float)local_318._0_4_ * auVar106._8_4_;
          auVar130._12_4_ = (float)local_318._0_4_ * auVar106._12_4_;
          auVar107._0_4_ = auVar106._0_4_ + auVar106._0_4_;
          auVar107._4_4_ = auVar106._4_4_ + auVar106._4_4_;
          auVar107._8_4_ = auVar106._8_4_ + auVar106._8_4_;
          auVar107._12_4_ = auVar106._12_4_ + auVar106._12_4_;
          auVar134 = divps(auVar119,auVar107);
          fVar117 = auVar130._4_4_;
          if (auVar130._0_4_ <= auVar130._4_4_) {
            fVar117 = auVar130._0_4_;
          }
          local_3dc = (0.35 / fVar117) * (0.35 / fVar117);
          local_2b8 = auVar130._4_4_;
          fStack_2b4 = auVar130._4_4_;
          fStack_2b0 = auVar130._4_4_;
          fStack_2ac = auVar130._4_4_;
          uVar59 = (uint)auVar130._4_4_ ^ (uint)DAT_0022f730;
          local_328 = (ulong)((undefined4)uVar81 & 0xff);
          local_320 = (ulong)((uint)(undefined4)uVar81 >> 8 & 0xff);
          auVar126._4_4_ = local_268._4_4_;
          auVar126._0_4_ = auVar126._4_4_;
          auVar126._8_4_ = auVar126._4_4_;
          auVar126._12_4_ = auVar126._4_4_;
          local_278 = auVar126;
          local_258 = ~auVar136 & auVar134;
          local_288._4_4_ = SUB164(~auVar136 & auVar134,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_3e8 = (ulong)(auVar34._0_4_ & 0xff);
          local_2a8 = auVar130;
          local_248._4_4_ = uVar59;
          local_248._0_4_ = auVar130._0_4_;
          fStack_240 = auVar130._0_4_;
          fStack_23c = (float)uVar59;
          lVar78 = 0;
          local_2d8 = lVar98;
          local_3c0 = psVar100;
          auVar134 = _DAT_0022f730;
          do {
            fVar117 = auVar126._0_4_;
            if (*(int *)(lVar98 + 0xc + lVar78 * 0x10) != 0) {
              lVar76 = lVar78 * 0x10 + lVar98;
              sVar71 = *(short *)(lVar76 + 4);
              if ((sVar71 != 0) && (sVar51 = *(short *)(lVar76 + 6), sVar51 != 0)) {
                local_2d0 = (short *)(lVar78 * 0x1c + *(long *)&psVar100[1].loca);
                info = (stbtt_fontinfo *)psVar100->data;
                local_3b0 = lVar76;
                local_2c8 = lVar78;
                iVar92 = stbtt_FindGlyphIndex(info,psVar100->index_map);
                lVar98 = local_3b0;
                *(uint *)(local_3b0 + 8) =
                     CONCAT22((short)((uint)*(undefined4 *)(local_3b0 + 8) >> 0x10) +
                              local_298._2_2_,
                              (short)*(undefined4 *)(local_3b0 + 8) + local_298._0_2_);
                *(short *)(local_3b0 + 4) = sVar71 - (short)local_4b0;
                *(short *)(local_3b0 + 6) = sVar51 - (short)local_4b0;
                uVar49 = *(ushort *)((long)&info->glyf + (long)psVar100->hhea + 2);
                uVar49 = uVar49 << 8 | uVar49 >> 8;
                iVar80 = psVar100->hmtx;
                pbVar90 = (byte *)((long)info + (ulong)uVar49 * 4 + (long)iVar80 + -4);
                pbVar101 = (byte *)((long)info + (ulong)uVar49 * 4 + (long)iVar80 + -3);
                if (iVar92 < (int)(uint)uVar49) {
                  pbVar90 = (byte *)((long)&info->userdata + (long)(iVar92 * 4) + (long)iVar80);
                  pbVar101 = (byte *)((long)&info->userdata + (long)(iVar92 * 4) + 1 + (long)iVar80)
                  ;
                }
                local_358 = (uint)*pbVar101;
                local_354 = (uint)*pbVar90;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar100,iVar92,(float)local_2a8._0_4_,local_2b8,fVar117,auVar130._0_4_,
                           &local_348,&local_34c,&local_2bc,&local_2c0);
                uVar49 = *(ushort *)(lVar98 + 8);
                local_370 = (uchar *)(ulong)*(ushort *)(lVar98 + 10);
                local_438 = (ulong)*(ushort *)(lVar98 + 4);
                local_3f8 = (ulong)*(ushort *)(lVar98 + 6);
                uVar59 = stbtt_GetGlyphShape(psVar100,iVar92,(stbtt_vertex **)&local_430);
                fVar96 = (float)(((int)local_438 - (int)local_3e8) + 1);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_3c0,iVar92,(float)local_2a8._0_4_,local_2b8,fVar117,auVar130._0_4_,
                           (int *)&local_4ac,&local_344,(int *)0x0,(int *)0x0);
                sVar58 = local_4ac;
                local_48c = fVar96;
                if (fVar96 != 0.0) {
                  iVar80 = ((int)local_3f8 - (int)local_498) + 1;
                  if ((iVar80 != 0) && (0 < (int)uVar59)) {
                    local_370 = local_388 + (long)local_370 * lVar83 + (ulong)uVar49;
                    local_438 = (ulong)(uint)((int)local_438 - (int)local_3e8);
                    local_3f8 = (ulong)(uint)((int)local_3f8 - (int)local_498);
                    lVar98 = CONCAT44(local_430._4_4_,(stbtt_uint32)local_430);
                    local_424 = local_344;
                    lVar78 = 0;
                    uVar95 = 0;
                    do {
                      uVar95 = uVar95 + (*(char *)(lVar98 + 0xc + lVar78) == '\x01');
                      lVar78 = lVar78 + 0xe;
                    } while ((ulong)uVar59 * 0xe != lVar78);
                    if (uVar95 != 0) {
                      uVar152 = 0;
                      local_440 = ImGui::MemAlloc((ulong)uVar95 * 4);
                      if (local_440 != (void *)0x0) {
                        bVar70 = false;
                        iVar60 = 0;
                        auVar41._8_8_ = 0;
                        auVar41._0_8_ = local_458._8_8_;
                        local_458 = auVar41 << 0x40;
                        iVar92 = 0;
                        bVar102 = true;
                        do {
                          bVar79 = bVar102;
                          if (bVar70) {
                            pvVar66 = ImGui::MemAlloc((long)iVar92 << 3);
                            local_458._0_8_ = pvVar66;
                            if (pvVar66 == (void *)0x0) {
                              ImGui::MemFree((void *)0x0);
                              ImGui::MemFree(local_440);
                              goto LAB_001f1e86;
                            }
                          }
                          local_238[0].data =
                               (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                          fVar117 = 0.0;
                          fVar96 = 0.0;
                          uVar81 = 0xffffffff;
                          lVar78 = 0;
                          do {
                            iVar92 = (int)local_238[0].data;
                            switch(*(undefined1 *)(lVar98 + 0xc + lVar78)) {
                            case 1:
                              if (-1 < (int)uVar81) {
                                *(int *)((long)local_440 + uVar81 * 4) =
                                     (int)local_238[0].data - iVar60;
                              }
                              uVar81 = (ulong)((int)uVar81 + 1);
                              auVar118 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar78)),
                                                 ZEXT416(*(uint *)(lVar98 + lVar78)),0x60);
                              fVar117 = (float)(auVar118._0_4_ >> 0x10);
                              fVar96 = (float)(auVar118._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              iVar60 = iVar92;
                              if ((stbtt__point *)local_458._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(local_458._0_8_ + (long)iVar92 * 8))->x = fVar117;
                                ((stbtt__point *)(local_458._0_8_ + (long)iVar92 * 8))->y = fVar96;
                              }
                              break;
                            case 2:
                              lVar76 = (long)(int)local_238[0].data;
                              auVar118 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar78)),
                                                 ZEXT416(*(uint *)(lVar98 + lVar78)),0x60);
                              fVar117 = (float)(auVar118._0_4_ >> 0x10);
                              fVar96 = (float)(auVar118._4_4_ >> 0x10);
                              local_238[0].data =
                                   (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                     (int)local_238[0].data + 1);
                              if ((stbtt__point *)local_458._0_8_ != (stbtt__point *)0x0) {
                                ((stbtt__point *)(local_458._0_8_ + lVar76 * 8))->x = fVar117;
                                ((stbtt__point *)(local_458._0_8_ + lVar76 * 8))->y = fVar96;
                              }
                              break;
                            case 3:
                              fVar139 = (float)(int)*(short *)(lVar98 + 6 + lVar78);
                              auVar130 = ZEXT416((uint)fVar139);
                              stbtt__tesselate_curve
                                        ((stbtt__point *)local_458._0_8_,(int *)local_238,fVar117,
                                         fVar96,(float)(int)*(short *)(lVar98 + 4 + lVar78),fVar139,
                                         (float)(int)*(short *)(lVar98 + lVar78),
                                         (float)(int)*(short *)(lVar98 + 2 + lVar78),local_3dc,0);
                              goto LAB_001f11e7;
                            case 4:
                              fVar139 = (float)(int)*(short *)(lVar98 + 6 + lVar78);
                              auVar130 = ZEXT416((uint)fVar139);
                              stbtt__tesselate_cubic
                                        ((stbtt__point *)local_458._0_8_,(int *)local_238,fVar117,
                                         fVar96,(float)(int)*(short *)(lVar98 + 4 + lVar78),fVar139,
                                         (float)(int)*(short *)(lVar98 + 8 + lVar78),
                                         (float)(int)*(short *)(lVar98 + 10 + lVar78),
                                         (float)(int)*(short *)(lVar98 + lVar78),
                                         (float)(int)*(short *)(lVar98 + 2 + lVar78),local_3dc,0);
LAB_001f11e7:
                              auVar118 = pshuflw(ZEXT416(*(uint *)(lVar98 + lVar78)),
                                                 ZEXT416(*(uint *)(lVar98 + lVar78)),0x60);
                              fVar117 = (float)(auVar118._0_4_ >> 0x10);
                              fVar96 = (float)(auVar118._4_4_ >> 0x10);
                            }
                            lVar78 = lVar78 + 0xe;
                          } while ((ulong)uVar59 * 0xe != lVar78);
                          *(int *)((long)local_440 + (long)(int)uVar81 * 4) =
                               (int)local_238[0].data - iVar60;
                          bVar70 = true;
                          iVar92 = (int)local_238[0].data;
                          bVar102 = false;
                        } while (bVar79);
                        pvVar66 = (void *)local_458._0_8_;
                        if ((void *)local_458._0_8_ != (void *)0x0) {
                          lVar98 = 0;
                          lVar78 = 0;
                          do {
                            lVar78 = (long)(int)lVar78 +
                                     (long)*(int *)((long)local_440 + lVar98 * 4);
                            lVar98 = lVar98 + 1;
                          } while (CONCAT44(uVar152,uVar95) != lVar98);
                          local_470 = (stbtt__edge *)ImGui::MemAlloc(lVar78 * 0x14 + 0x14);
                          if (local_470 != (stbtt__edge *)0x0) {
                            lVar98 = 0;
                            uVar59 = 0;
                            iVar92 = 0;
                            do {
                              iVar60 = *(int *)((long)local_440 + lVar98 * 4);
                              if (0 < iVar60) {
                                lVar78 = local_458._0_8_ + (long)iVar92 * 8;
                                uVar77 = (ulong)(iVar60 - 1);
                                uVar81 = 0;
                                iVar61 = iVar60;
                                do {
                                  iVar93 = (int)uVar77;
                                  fVar117 = *(float *)(lVar78 + 4 + (long)iVar93 * 8);
                                  fVar96 = *(float *)((long)pvVar66 +
                                                     uVar81 * 8 + (long)iVar92 * 8 + 4);
                                  if ((fVar117 != fVar96) || (NAN(fVar117) || NAN(fVar96))) {
                                    iVar94 = (int)uVar81;
                                    iVar61 = iVar93;
                                    if (fVar117 <= fVar96) {
                                      iVar61 = iVar94;
                                      iVar94 = iVar93;
                                    }
                                    local_470[(int)uVar59].invert = (uint)(fVar96 < fVar117);
                                    uVar154 = *(undefined8 *)(lVar78 + (long)iVar61 * 8);
                                    uVar178 = *(undefined8 *)(lVar78 + (long)iVar94 * 8);
                                    psVar85 = local_470 + (int)uVar59;
                                    psVar85->x0 = (float)uVar154 * (float)local_248._0_4_ + 0.0;
                                    psVar85->y0 = (float)((ulong)uVar154 >> 0x20) *
                                                  (float)local_248._4_4_ + 0.0;
                                    psVar85->x1 = (float)uVar178 * fStack_240 + 0.0;
                                    psVar85->y1 = (float)((ulong)uVar178 >> 0x20) * fStack_23c + 0.0
                                    ;
                                    uVar59 = uVar59 + 1;
                                    iVar61 = *(int *)((long)local_440 + lVar98 * 4);
                                  }
                                  uVar77 = uVar81 & 0xffffffff;
                                  uVar81 = uVar81 + 1;
                                } while ((long)uVar81 < (long)iVar61);
                              }
                              iVar92 = iVar92 + iVar60;
                              lVar98 = lVar98 + 1;
                            } while (lVar98 != CONCAT44(uVar152,uVar95));
                            stbtt__sort_edges_quicksort(local_470,uVar59);
                            iVar92 = (int)local_438;
                            if (1 < (int)uVar59) {
                              uVar81 = 1;
                              lVar98 = 2;
                              psVar85 = local_470;
                              do {
                                uVar2 = local_470[uVar81].x0;
                                uVar3 = local_470[uVar81].y0;
                                iVar60 = local_470[uVar81].invert;
                                local_238[0].cursor = iVar60;
                                local_238[0].data = *(uchar **)&local_470[uVar81].x1;
                                lVar78 = lVar98;
                                psVar91 = psVar85;
                                do {
                                  if (psVar91->y0 <= (float)uVar3) {
                                    uVar95 = (int)lVar78 - 1;
                                    goto LAB_001f1445;
                                  }
                                  psVar91[1].invert = psVar91->invert;
                                  fVar117 = psVar91->y0;
                                  fVar96 = psVar91->x1;
                                  fVar139 = psVar91->y1;
                                  psVar91[1].x0 = psVar91->x0;
                                  psVar91[1].y0 = fVar117;
                                  psVar91[1].x1 = fVar96;
                                  psVar91[1].y1 = fVar139;
                                  lVar78 = lVar78 + -1;
                                  psVar91 = psVar91 + -1;
                                } while (1 < lVar78);
                                uVar95 = 0;
LAB_001f1445:
                                if (uVar81 != uVar95) {
                                  local_470[(int)uVar95].x0 = (float)uVar2;
                                  local_470[(int)uVar95].y0 = (float)uVar3;
                                  *(uchar **)&local_470[(int)uVar95].x1 = local_238[0].data;
                                  local_470[(int)uVar95].invert = iVar60;
                                }
                                uVar81 = uVar81 + 1;
                                lVar98 = lVar98 + 1;
                                psVar85 = psVar85 + 1;
                              } while (uVar81 != uVar59);
                            }
                            local_4a8._0_8_ = (stbtt__active_edge *)0x0;
                            scanline = local_238;
                            if (0x3f < iVar92) {
                              scanline = (stbtt__buf *)
                                         ImGui::MemAlloc((ulong)(uint)local_48c * 8 + 4);
                              iVar92 = (int)local_438;
                            }
                            local_470[(int)uVar59].y0 = (float)(iVar80 + local_424) + 1.0;
                            if ((uint)local_3f8 < 0x7fffffff) {
                              local_2f0 = (long)(int)local_48c;
                              local_350 = (float)(int)sVar58;
                              local_368 = (float *)((long)&scanline->data + local_2f0 * 4);
                              local_330 = local_368 + 1;
                              local_2e0 = local_2f0 * 4;
                              local_2e8 = (long)iVar92 * 4 + 8;
                              local_41c = (float)(int)local_48c;
                              local_380 = 0;
                              psVar69 = (stbtt__active_edge *)0x0;
                              local_378 = 0;
                              local_3b8 = (undefined8 *)0x0;
                              local_420 = 0;
                              local_3f0 = (stbtt__active_edge *)0x0;
                              psVar85 = local_470;
                              iVar80 = local_424;
                              do {
                                local_35c = iVar80;
                                iVar80 = local_424;
                                fVar96 = (float)local_35c;
                                fVar117 = fVar96 + 1.0;
                                memset(scanline,0,local_2e0);
                                memset(local_368,0,local_2e8);
                                if (psVar69 != (stbtt__active_edge *)0x0) {
                                  psVar67 = (stbtt__active_edge *)local_4a8;
                                  do {
                                    if (psVar69->ey <= fVar96) {
                                      psVar67->next = psVar69->next;
                                      psVar69->direction = 0.0;
                                      psVar69->next = local_3f0;
                                      local_3f0 = psVar69;
                                      psVar69 = psVar67;
                                    }
                                    ppsVar48 = &psVar69->next;
                                    psVar67 = psVar69;
                                    psVar69 = *ppsVar48;
                                  } while (*ppsVar48 != (stbtt__active_edge *)0x0);
                                }
                                fVar139 = psVar85->y0;
                                psVar69 = local_3f0;
                                iVar92 = local_420;
                                if (fVar139 <= fVar117) {
                                  bVar102 = (int)local_378 == 0;
                                  do {
                                    fVar140 = psVar85->y1;
                                    if ((fVar139 != fVar140) || (NAN(fVar139) || NAN(fVar140))) {
                                      if (psVar69 == (stbtt__active_edge *)0x0) {
                                        if (iVar92 == 0) {
                                          puVar82 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                          if (puVar82 == (undefined8 *)0x0) {
                                            psVar69 = (stbtt__active_edge *)0x0;
                                            iVar92 = 0;
                                            goto LAB_001f1def;
                                          }
                                          *puVar82 = local_3b8;
                                          fVar139 = psVar85->y0;
                                          fVar140 = psVar85->y1;
                                          iVar92 = 799;
                                          local_3b8 = puVar82;
                                        }
                                        else {
                                          iVar92 = iVar92 + -1;
                                        }
                                        psVar69 = (stbtt__active_edge *)
                                                  (local_3b8 + (long)iVar92 * 4 + 1);
                                        psVar67 = (stbtt__active_edge *)0x0;
                                      }
                                      else {
                                        psVar67 = psVar69->next;
                                      }
                                      fVar141 = psVar85->x0;
                                      fVar142 = (psVar85->x1 - fVar141) / (fVar140 - fVar139);
                                      psVar69->fdx = fVar142;
                                      psVar69->fdy = (float)(-(uint)(fVar142 != 0.0) &
                                                            (uint)(1.0 / fVar142));
                                      psVar69->fx = ((fVar96 - fVar139) * fVar142 + fVar141) -
                                                    local_350;
                                      psVar69->direction =
                                           *(float *)(&DAT_002a7cd4 +
                                                     (ulong)(psVar85->invert == 0) * 4);
                                      psVar69->sy = fVar139;
                                      psVar69->ey = fVar140;
                                      psVar69->next = (stbtt__active_edge *)0x0;
                                      if (fVar140 < fVar96 && (bVar102 && iVar80 != 0)) {
                                        psVar69->ey = fVar96;
                                      }
                                      psVar69->next = (stbtt__active_edge *)local_4a8._0_8_;
                                      local_4a8._0_8_ = psVar69;
                                      psVar69 = psVar67;
                                    }
LAB_001f1def:
                                    fVar139 = psVar85[1].y0;
                                    psVar85 = psVar85 + 1;
                                  } while (fVar139 <= fVar117);
                                }
                                local_3f0 = psVar69;
                                local_420 = iVar92;
                                psVar69 = (stbtt__active_edge *)local_4a8._0_8_;
                                puVar82 = local_3b8;
                                for (psVar67 = (stbtt__active_edge *)local_4a8._0_8_;
                                    local_4a8._0_8_ = psVar69, local_3b8 = puVar82,
                                    psVar67 != (stbtt__active_edge *)0x0; psVar67 = psVar67->next) {
                                  fVar139 = psVar67->fx;
                                  fVar140 = psVar67->fdx;
                                  if ((fVar140 != 0.0) || (NAN(fVar140))) {
                                    fVar147 = fVar140 + fVar139;
                                    fVar141 = psVar67->sy;
                                    fVar142 = (float)(~-(uint)(fVar96 < fVar141) & (uint)fVar139 |
                                                     (uint)((fVar141 - fVar96) * fVar140 + fVar139)
                                                     & -(uint)(fVar96 < fVar141));
                                    if (0.0 <= fVar142) {
                                      fVar148 = psVar67->ey;
                                      fVar150 = (float)(-(uint)(fVar148 < fVar117) &
                                                        (uint)((fVar148 - fVar96) * fVar140 +
                                                              fVar139) |
                                                       ~-(uint)(fVar148 < fVar117) & (uint)fVar147);
                                      if (((0.0 <= fVar150) && (fVar142 < local_41c)) &&
                                         (fVar150 < local_41c)) {
                                        if (fVar141 <= fVar96) {
                                          fVar141 = fVar96;
                                        }
                                        iVar80 = (int)fVar142;
                                        if (fVar117 <= fVar148) {
                                          fVar148 = fVar117;
                                        }
                                        iVar92 = (int)fVar150;
                                        if (iVar80 == iVar92) {
                                          lVar98 = (long)iVar80;
                                          *(float *)((long)&scanline->data + lVar98 * 4) =
                                               (((fVar150 - (float)iVar80) +
                                                (fVar142 - (float)iVar80)) * -0.5 + 1.0) *
                                               psVar67->direction * (fVar148 - fVar141) +
                                               *(float *)((long)&scanline->data + lVar98 * 4);
                                          fVar139 = (fVar148 - fVar141) * psVar67->direction;
                                        }
                                        else {
                                          fVar140 = psVar67->fdy;
                                          iVar60 = iVar80;
                                          fVar151 = fVar142;
                                          if (fVar150 < fVar142) {
                                            fVar160 = fVar96 - fVar141;
                                            fVar141 = (fVar96 - fVar148) + fVar117;
                                            fVar140 = -fVar140;
                                            iVar60 = iVar92;
                                            iVar92 = iVar80;
                                            fVar139 = fVar147;
                                            fVar151 = fVar150;
                                            fVar150 = fVar142;
                                            fVar148 = fVar160 + fVar117;
                                          }
                                          iVar80 = iVar60 + 1;
                                          fVar147 = ((float)iVar80 - fVar139) * fVar140 + fVar96;
                                          fVar139 = psVar67->direction;
                                          fVar142 = (fVar147 - fVar141) * fVar139;
                                          lVar98 = (long)iVar60;
                                          *(float *)((long)&scanline->data + lVar98 * 4) =
                                               (((fVar151 - (float)iVar60) + 1.0) * -0.5 + 1.0) *
                                               fVar142 + *(float *)((long)&scanline->data +
                                                                   lVar98 * 4);
                                          if (iVar92 - iVar80 != 0 && iVar80 <= iVar92) {
                                            do {
                                              *(float *)((long)&scanline->data + lVar98 * 4 + 4) =
                                                   fVar140 * fVar139 * 0.5 + fVar142 +
                                                   *(float *)((long)&scanline->data + lVar98 * 4 + 4
                                                             );
                                              fVar142 = fVar142 + fVar140 * fVar139;
                                              lVar98 = lVar98 + 1;
                                            } while (iVar92 + -1 != (int)lVar98);
                                          }
                                          lVar98 = (long)iVar92;
                                          *(float *)((long)&scanline->data + lVar98 * 4) =
                                               (fVar148 -
                                               (fVar140 * (float)(iVar92 - iVar80) + fVar147)) *
                                               (((fVar150 - (float)iVar92) + 0.0) * -0.5 + 1.0) *
                                               fVar139 + fVar142 +
                                               *(float *)((long)&scanline->data + lVar98 * 4);
                                          fVar139 = (fVar148 - fVar141) * fVar139;
                                        }
                                        local_330[lVar98] = fVar139 + local_330[lVar98];
                                        goto LAB_001f1ba5;
                                      }
                                    }
                                    if ((uint)local_438 < 0x7fffffff) {
                                      local_398 = (ImFontConfig *)(ulong)(uint)fVar139;
                                      uStack_390 = 0;
                                      uStack_38c = 0;
                                      local_468._4_4_ = (undefined4)((ulong)local_468 >> 0x20);
                                      local_468 = CONCAT44(local_468._4_4_,fVar140);
                                      local_488 = ZEXT416((uint)fVar147);
                                      fVar141 = 0.0;
                                      do {
                                        fVar147 = (float)(int)fVar141;
                                        fVar148 = (float)((int)fVar141 + 1);
                                        fVar150 = (float)(int)fVar148;
                                        fVar142 = (fVar147 - fVar139) / fVar140 + fVar96;
                                        fVar140 = (fVar150 - fVar139) / fVar140 + fVar96;
                                        fVar151 = local_488._0_4_;
                                        if ((fVar147 <= fVar139) || (fVar151 <= fVar150)) {
                                          if ((fVar147 <= fVar151) || (fVar139 <= fVar150)) {
                                            fVar160 = fVar96;
                                            if (((fVar147 <= fVar139) || (fVar151 <= fVar147)) &&
                                               ((fVar147 <= fVar151 || (fVar139 <= fVar147)))) {
                                              fVar142 = fVar96;
                                              if (((fVar139 < fVar150) && (fVar150 < fVar151)) ||
                                                 ((fVar147 = fVar139, fVar151 < fVar150 &&
                                                  (fVar150 < fVar139)))) goto LAB_001f189c;
                                              goto LAB_001f194a;
                                            }
                                          }
                                          else {
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,(int)fVar141,psVar67,
                                                       fVar139,fVar96,fVar150,fVar140);
                                            fVar139 = fVar150;
                                            fVar160 = fVar140;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar67,fVar139,
                                                     fVar160,fVar147,fVar142);
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar67,fVar139,
                                                     fVar96,fVar147,fVar142);
                                          fVar139 = fVar147;
LAB_001f189c:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,(int)fVar141,psVar67,fVar139,
                                                     fVar142,fVar150,fVar140);
                                          fVar147 = fVar150;
                                          fVar142 = fVar140;
                                        }
LAB_001f194a:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,(int)fVar141,psVar67,fVar147,
                                                   fVar142,local_488._0_4_,fVar117);
                                        fVar139 = local_398._0_4_;
                                        fVar140 = (float)local_468;
                                        fVar141 = fVar148;
                                      } while (local_48c != fVar148);
                                    }
                                  }
                                  else if (fVar139 < local_41c) {
                                    if (0.0 <= fVar139) {
                                      local_398 = (ImFontConfig *)(ulong)(uint)fVar139;
                                      uStack_390 = 0;
                                      uStack_38c = 0;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,(int)fVar139,psVar67,fVar139,
                                                 fVar96,fVar139,fVar117);
                                      iVar80 = (int)fVar139 + 1;
                                      fVar139 = local_398._0_4_;
                                    }
                                    else {
                                      iVar80 = 0;
                                    }
                                    stbtt__handle_clipped_edge
                                              (local_368,iVar80,psVar67,fVar139,fVar96,fVar139,
                                               fVar117);
                                  }
LAB_001f1ba5:
                                  psVar69 = (stbtt__active_edge *)local_4a8._0_8_;
                                  puVar82 = local_3b8;
                                }
                                uVar59 = (uint)DAT_00299c80;
                                auVar130._0_12_ = ZEXT812(0x437f0000);
                                auVar130._12_4_ = 0.0;
                                psVar67 = psVar69;
                                if ((uint)local_438 < 0x7fffffff) {
                                  fVar117 = 0.0;
                                  psVar68 = scanline;
                                  uVar81 = local_380;
                                  lVar98 = local_2f0;
                                  do {
                                    fVar117 = fVar117 + *(float *)((long)&psVar68->data +
                                                                  local_2f0 * 4);
                                    iVar80 = (int)((float)((uint)(*(float *)&psVar68->data + fVar117
                                                                 ) & uVar59) * 255.0 + 0.5);
                                    uVar84 = (uchar)iVar80;
                                    if (0xfe < iVar80) {
                                      uVar84 = 0xff;
                                    }
                                    local_370[(int)uVar81] = uVar84;
                                    uVar81 = (ulong)((int)uVar81 + 1);
                                    psVar68 = (stbtt__buf *)((long)&psVar68->data + 4);
                                    lVar98 = lVar98 + -1;
                                  } while (lVar98 != 0);
                                }
                                for (; psVar67 != (stbtt__active_edge *)0x0; psVar67 = psVar67->next
                                    ) {
                                  psVar67->fx = psVar67->fdx + psVar67->fx;
                                }
                                iVar92 = (int)local_378;
                                local_378 = (ulong)(iVar92 + 1);
                                local_380 = (ulong)(uint)((int)local_380 + local_45c);
                                iVar80 = local_35c + 1;
                              } while (iVar92 != (uint)local_3f8);
                              while (puVar82 != (undefined8 *)0x0) {
                                puVar10 = (undefined8 *)*puVar82;
                                ImGui::MemFree(puVar82);
                                puVar82 = puVar10;
                              }
                            }
                            pvVar66 = (void *)local_458._0_8_;
                            if (scanline != local_238) {
                              ImGui::MemFree(scanline);
                            }
                            ImGui::MemFree(local_470);
                          }
                          ImGui::MemFree(local_440);
                          ImGui::MemFree(pvVar66);
                        }
                      }
                    }
                  }
                }
LAB_001f1e86:
                ImGui::MemFree((void *)CONCAT44(local_430._4_4_,(stbtt_uint32)local_430));
                uVar81 = (ulong)*(ushort *)(local_3b0 + 8);
                uVar49 = *(ushort *)(local_3b0 + 10);
                uVar113 = *(ushort *)(local_3b0 + 4);
                uVar59 = (uint)uVar113;
                uVar50 = *(ushort *)(local_3b0 + 6);
                iVar80 = (int)local_498;
                auVar132 = _DAT_002a98e0;
                auVar118 = _DAT_002a98c0;
                if (1 < (byte)local_328) {
                  local_238[0].data = (uchar *)0x0;
                  uVar95 = 0;
                  if (uVar50 == 0) {
                    uVar50 = 0;
                  }
                  else {
                    puVar65 = local_388 +
                              (long)(int)((uint)uVar49 * local_45c) +
                              (ulong)*(ushort *)(local_3b0 + 8);
                    iVar80 = (uint)uVar113 - (int)local_3e8;
                    uVar59 = iVar80 + 1;
                    uVar81 = (ulong)uVar59;
                    do {
                      uVar77 = local_328;
                      memset(local_238,0,local_328);
                      auVar132 = _DAT_002a98e0;
                      auVar118 = _DAT_002a98c0;
                      uVar97 = uVar59;
                      switch((int)uVar77) {
                      case 2:
                        if (iVar80 < 0) {
LAB_001f2113:
                          uVar77 = 0;
                          uVar97 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar77 = 0;
                          do {
                            bVar103 = puVar65[uVar87];
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 2 & 7)) =
                                 bVar103;
                            uVar72 = (int)uVar77 + ((uint)bVar103 - (uint)bVar4);
                            uVar77 = (ulong)uVar72;
                            puVar65[uVar87] = (uchar)(uVar72 >> 1);
                            uVar87 = uVar87 + 1;
                          } while (uVar81 != uVar87);
                        }
                        break;
                      case 3:
                        if (iVar80 < 0) goto LAB_001f2113;
                        uVar87 = 0;
                        uVar77 = 0;
                        do {
                          bVar103 = puVar65[uVar87];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 3 & 7)) =
                               bVar103;
                          uVar77 = (ulong)((int)uVar77 + ((uint)bVar103 - (uint)bVar4));
                          puVar65[uVar87] = (uchar)(uVar77 / 3);
                          uVar87 = uVar87 + 1;
                        } while (uVar81 != uVar87);
                        break;
                      case 4:
                        if (iVar80 < 0) goto LAB_001f2113;
                        uVar87 = 0;
                        uVar77 = 0;
                        do {
                          bVar103 = puVar65[uVar87];
                          uVar86 = (ulong)((uint)uVar87 & 7);
                          bVar4 = *(byte *)((long)&local_238[0].data + uVar86);
                          *(byte *)((long)&local_238[0].data + (uVar86 ^ 4)) = bVar103;
                          uVar72 = (int)uVar77 + ((uint)bVar103 - (uint)bVar4);
                          uVar77 = (ulong)uVar72;
                          puVar65[uVar87] = (uchar)(uVar72 >> 2);
                          uVar87 = uVar87 + 1;
                        } while (uVar81 != uVar87);
                        break;
                      case 5:
                        if (iVar80 < 0) goto LAB_001f2113;
                        uVar87 = 0;
                        uVar77 = 0;
                        do {
                          bVar103 = puVar65[uVar87];
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 5 & 7)) =
                               bVar103;
                          uVar77 = (ulong)((int)uVar77 + ((uint)bVar103 - (uint)bVar4));
                          puVar65[uVar87] = (uchar)(uVar77 / 5);
                          uVar87 = uVar87 + 1;
                        } while (uVar81 != uVar87);
                        break;
                      default:
                        if (iVar80 < 0) {
                          uVar77 = 0;
                          uVar97 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar77 = 0;
                          do {
                            bVar103 = puVar65[uVar87];
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data +
                                     (ulong)((int)local_3e8 + (uint)uVar87 & 7)) = bVar103;
                            uVar77 = (ulong)((int)uVar77 + ((uint)bVar103 - (uint)bVar4));
                            puVar65[uVar87] = (uchar)(uVar77 / (local_3e8 & 0xffffffff));
                            uVar87 = uVar87 + 1;
                          } while (uVar81 != uVar87);
                        }
                      }
                      if ((int)uVar97 < (int)(uint)uVar113) {
                        uVar87 = (ulong)uVar97;
                        do {
                          uVar77 = (ulong)((int)uVar77 -
                                          (uint)*(byte *)((long)&local_238[0].data +
                                                         (ulong)((uint)uVar87 & 7)));
                          puVar65[uVar87] = (uchar)(uVar77 / (local_3e8 & 0xffffffff));
                          uVar87 = uVar87 + 1;
                        } while ((int)uVar87 < (int)(uint)uVar113);
                      }
                      puVar65 = puVar65 + lVar83;
                      uVar95 = uVar95 + 1;
                    } while (uVar95 != uVar50);
                    uVar81 = (ulong)*(ushort *)(local_3b0 + 8);
                    uVar49 = *(ushort *)(local_3b0 + 10);
                    uVar59 = (uint)*(ushort *)(local_3b0 + 4);
                    uVar50 = *(ushort *)(local_3b0 + 6);
                    iVar80 = (int)local_498;
                  }
                }
                sVar71 = (short)uVar81;
                if (1 < (byte)local_320) {
                  local_238[0].data = (uchar *)0x0;
                  uVar95 = 0;
                  if ((short)uVar59 == 0) {
                    uVar59 = 0;
                  }
                  else {
                    pbVar101 = local_388 + (long)(int)((uint)uVar49 * local_45c) + uVar81;
                    iVar80 = (uint)uVar50 - iVar80;
                    uVar97 = iVar80 + 1;
                    uVar81 = (ulong)uVar97;
                    do {
                      uVar77 = local_320;
                      memset(local_238,0,local_320);
                      auVar132 = _DAT_002a98e0;
                      auVar118 = _DAT_002a98c0;
                      uVar72 = uVar97;
                      switch((int)uVar77) {
                      case 2:
                        if (iVar80 < 0) {
LAB_001f24bf:
                          uVar77 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar77 = 0;
                          pbVar90 = pbVar101;
                          do {
                            bVar103 = *pbVar90;
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 2 & 7)) =
                                 bVar103;
                            uVar73 = (int)uVar77 + ((uint)bVar103 - (uint)bVar4);
                            uVar77 = (ulong)uVar73;
                            *pbVar90 = (byte)(uVar73 >> 1);
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar83;
                          } while (uVar81 != uVar87);
                        }
                        break;
                      case 3:
                        if (iVar80 < 0) goto LAB_001f24bf;
                        uVar87 = 0;
                        uVar77 = 0;
                        pbVar90 = pbVar101;
                        do {
                          bVar103 = *pbVar90;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 3 & 7)) =
                               bVar103;
                          uVar77 = (ulong)((int)uVar77 + ((uint)bVar103 - (uint)bVar4));
                          *pbVar90 = (byte)(uVar77 / 3);
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar83;
                        } while (uVar81 != uVar87);
                        break;
                      case 4:
                        if (iVar80 < 0) goto LAB_001f24bf;
                        uVar87 = 0;
                        uVar77 = 0;
                        pbVar90 = pbVar101;
                        do {
                          bVar103 = *pbVar90;
                          uVar86 = (ulong)((uint)uVar87 & 7);
                          bVar4 = *(byte *)((long)&local_238[0].data + uVar86);
                          *(byte *)((long)&local_238[0].data + (uVar86 ^ 4)) = bVar103;
                          uVar73 = (int)uVar77 + ((uint)bVar103 - (uint)bVar4);
                          uVar77 = (ulong)uVar73;
                          *pbVar90 = (byte)(uVar73 >> 2);
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar83;
                        } while (uVar81 != uVar87);
                        break;
                      case 5:
                        if (iVar80 < 0) goto LAB_001f24bf;
                        uVar87 = 0;
                        uVar77 = 0;
                        pbVar90 = pbVar101;
                        do {
                          bVar103 = *pbVar90;
                          bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 + 5 & 7)) =
                               bVar103;
                          uVar77 = (ulong)((int)uVar77 + ((uint)bVar103 - (uint)bVar4));
                          *pbVar90 = (byte)(uVar77 / 5);
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar83;
                        } while (uVar81 != uVar87);
                        break;
                      default:
                        if (iVar80 < 0) {
                          uVar77 = 0;
                          uVar72 = 0;
                        }
                        else {
                          uVar87 = 0;
                          uVar77 = 0;
                          pbVar90 = pbVar101;
                          do {
                            bVar103 = *pbVar90;
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar87 & 7));
                            *(byte *)((long)&local_238[0].data +
                                     (ulong)((int)local_498 + (uint)uVar87 & 7)) = bVar103;
                            uVar77 = (ulong)((int)uVar77 + ((uint)bVar103 - (uint)bVar4));
                            *pbVar90 = (byte)(uVar77 / (local_498 & 0xffffffff));
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar83;
                          } while (uVar81 != uVar87);
                        }
                      }
                      if ((int)uVar72 < (int)(uint)uVar50) {
                        uVar87 = (ulong)(int)uVar72;
                        pbVar90 = pbVar101 + lVar83 * uVar87;
                        do {
                          uVar77 = (ulong)((int)uVar77 -
                                          (uint)*(byte *)((long)&local_238[0].data +
                                                         (ulong)((uint)uVar87 & 7)));
                          *pbVar90 = (byte)(uVar77 / (local_498 & 0xffffffff));
                          uVar87 = uVar87 + 1;
                          pbVar90 = pbVar90 + lVar83;
                        } while (uVar50 != uVar87);
                      }
                      pbVar101 = pbVar101 + 1;
                      uVar95 = uVar95 + 1;
                    } while (uVar95 != uVar59);
                    sVar71 = *(short *)(local_3b0 + 8);
                    uVar49 = *(ushort *)(local_3b0 + 10);
                    uVar59 = (uint)*(ushort *)(local_3b0 + 4);
                    uVar50 = *(ushort *)(local_3b0 + 6);
                  }
                }
                *local_2d0 = sVar71;
                local_2d0[1] = uVar49;
                local_2d0[2] = sVar71 + (short)uVar59;
                local_2d0[3] = uVar50 + uVar49;
                *(float *)(local_2d0 + 8) =
                     (float)(int)(short)((short)(local_354 << 8) + (short)local_358) *
                     (float)local_318._0_4_;
                *(ulong *)(local_2d0 + 4) =
                     CONCAT44((float)local_34c * local_268._4_4_ + (float)local_258._4_4_,
                              (float)local_348 * local_268._0_4_ + (float)local_258._0_4_);
                *(float *)(local_2d0 + 10) =
                     (float)(int)(uVar59 + local_348) * local_268._0_4_ + (float)local_258._0_4_;
                *(float *)(local_2d0 + 0xc) =
                     (float)(int)((uint)uVar50 + local_34c) * (float)local_278._0_4_ +
                     (float)local_288._0_4_;
                iVar80 = local_3c0[1].fontstart;
                lVar98 = local_2d8;
                lVar78 = local_2c8;
                psVar100 = local_3c0;
                auVar134 = _DAT_0022f730;
                auVar126 = local_268;
              }
            }
            lVar78 = lVar78 + 1;
          } while (lVar78 < iVar80);
        }
        fVar117 = local_2f8[local_338].RasterizerMultiply;
        if ((fVar117 != 1.0) || (NAN(fVar117))) {
          lVar98 = 0;
          auVar120 = _DAT_002a9880;
          auVar127 = _DAT_002a9870;
          auVar131 = _DAT_002a9860;
          auVar133 = _DAT_002a9850;
          do {
            fVar96 = auVar118._0_4_;
            fVar139 = auVar118._4_4_;
            fVar140 = auVar118._8_4_;
            fVar141 = auVar118._12_4_;
            auVar118 = auVar127 & _DAT_002a9890 | _DAT_002a98a0;
            uVar59 = auVar127._4_4_;
            uVar95 = auVar127._8_4_;
            uVar97 = auVar127._12_4_;
            auVar134 = auVar120 & _DAT_002a9890 | _DAT_002a98a0;
            uVar72 = auVar120._4_4_;
            uVar73 = auVar120._8_4_;
            uVar149 = auVar120._12_4_;
            auVar166 = auVar133 & _DAT_002a9890 | _DAT_002a98a0;
            uVar159 = auVar133._4_4_;
            uVar161 = auVar133._8_4_;
            uVar163 = auVar133._12_4_;
            auVar104 = auVar131 & _DAT_002a9890 | _DAT_002a98a0;
            uVar170 = auVar131._4_4_;
            uVar172 = auVar131._8_4_;
            uVar174 = auVar131._12_4_;
            fVar165 = (((float)(auVar131._0_4_ >> 0x10 | 0x53000000) - fVar96) + auVar104._0_4_) *
                      fVar117;
            fVar171 = (((float)(uVar170 >> 0x10 | 0x53000000) - fVar139) + auVar104._4_4_) * fVar117
            ;
            fVar173 = (((float)(uVar172 >> 0x10 | 0x53000000) - fVar140) + auVar104._8_4_) * fVar117
            ;
            fVar175 = (((float)(uVar174 >> 0x10 | 0x53000000) - fVar141) + auVar104._12_4_) *
                      fVar117;
            fVar151 = (((float)(auVar133._0_4_ >> 0x10 | 0x53000000) - fVar96) + auVar166._0_4_) *
                      fVar117;
            fVar160 = (((float)(uVar159 >> 0x10 | 0x53000000) - fVar139) + auVar166._4_4_) * fVar117
            ;
            fVar162 = (((float)(uVar161 >> 0x10 | 0x53000000) - fVar140) + auVar166._8_4_) * fVar117
            ;
            fVar164 = (((float)(uVar163 >> 0x10 | 0x53000000) - fVar141) + auVar166._12_4_) *
                      fVar117;
            fVar142 = (((float)(auVar120._0_4_ >> 0x10 | 0x53000000) - fVar96) + auVar134._0_4_) *
                      fVar117;
            fVar147 = (((float)(uVar72 >> 0x10 | 0x53000000) - fVar139) + auVar134._4_4_) * fVar117;
            fVar148 = (((float)(uVar73 >> 0x10 | 0x53000000) - fVar140) + auVar134._8_4_) * fVar117;
            fVar150 = (((float)(uVar149 >> 0x10 | 0x53000000) - fVar141) + auVar134._12_4_) *
                      fVar117;
            fVar96 = (((float)(auVar127._0_4_ >> 0x10 | 0x53000000) - fVar96) + auVar118._0_4_) *
                     fVar117;
            fVar139 = (((float)(uVar59 >> 0x10 | 0x53000000) - fVar139) + auVar118._4_4_) * fVar117;
            fVar140 = (((float)(uVar95 >> 0x10 | 0x53000000) - fVar140) + auVar118._8_4_) * fVar117;
            fVar141 = (((float)(uVar97 >> 0x10 | 0x53000000) - fVar141) + auVar118._12_4_) * fVar117
            ;
            auVar138._0_4_ = (int)fVar96;
            auVar138._4_4_ = (int)fVar139;
            auVar138._8_4_ = (int)fVar140;
            auVar138._12_4_ = (int)fVar141;
            auVar186._0_4_ = auVar138._0_4_ >> 0x1f;
            auVar186._4_4_ = auVar138._4_4_ >> 0x1f;
            auVar186._8_4_ = auVar138._8_4_ >> 0x1f;
            auVar186._12_4_ = auVar138._12_4_ >> 0x1f;
            auVar137._0_4_ = (int)(fVar96 - 2.1474836e+09);
            auVar137._4_4_ = (int)(fVar139 - 2.1474836e+09);
            auVar137._8_4_ = (int)(fVar140 - 2.1474836e+09);
            auVar137._12_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar138 = auVar137 & auVar186 | auVar138;
            auVar146._0_4_ = (int)fVar142;
            auVar146._4_4_ = (int)fVar147;
            auVar146._8_4_ = (int)fVar148;
            auVar146._12_4_ = (int)fVar150;
            auVar187._0_4_ = auVar146._0_4_ >> 0x1f;
            auVar187._4_4_ = auVar146._4_4_ >> 0x1f;
            auVar187._8_4_ = auVar146._8_4_ >> 0x1f;
            auVar187._12_4_ = auVar146._12_4_ >> 0x1f;
            auVar145._0_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar145._4_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar145._8_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar145._12_4_ = (int)(fVar150 - 2.1474836e+09);
            auVar146 = auVar145 & auVar187 | auVar146;
            auVar182._0_4_ = (int)fVar151;
            auVar182._4_4_ = (int)fVar160;
            auVar182._8_4_ = (int)fVar162;
            auVar182._12_4_ = (int)fVar164;
            auVar190._0_4_ = auVar182._0_4_ >> 0x1f;
            auVar190._4_4_ = auVar182._4_4_ >> 0x1f;
            auVar190._8_4_ = auVar182._8_4_ >> 0x1f;
            auVar190._12_4_ = auVar182._12_4_ >> 0x1f;
            auVar181._0_4_ = (int)(fVar151 - 2.1474836e+09);
            auVar181._4_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar181._8_4_ = (int)(fVar162 - 2.1474836e+09);
            auVar181._12_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar182 = auVar181 & auVar190 | auVar182;
            auVar168._0_4_ = (int)fVar165;
            auVar168._4_4_ = (int)fVar171;
            auVar168._8_4_ = (int)fVar173;
            auVar168._12_4_ = (int)fVar175;
            auVar188._0_4_ = auVar168._0_4_ >> 0x1f;
            auVar188._4_4_ = auVar168._4_4_ >> 0x1f;
            auVar188._8_4_ = auVar168._8_4_ >> 0x1f;
            auVar188._12_4_ = auVar168._12_4_ >> 0x1f;
            auVar167._0_4_ = (int)(fVar165 - 2.1474836e+09);
            auVar167._4_4_ = (int)(fVar171 - 2.1474836e+09);
            auVar167._8_4_ = (int)(fVar173 - 2.1474836e+09);
            auVar167._12_4_ = (int)(fVar175 - 2.1474836e+09);
            auVar168 = auVar167 & auVar188 | auVar168;
            auVar118 = auVar168 ^ _DAT_0022f730;
            auVar157._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar157._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar157._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar157._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar157 & auVar132 | auVar168 & auVar157;
            auVar134 = auVar182 ^ _DAT_0022f730;
            auVar189._0_4_ = -(uint)(auVar134._0_4_ < -0x7fffff01);
            auVar189._4_4_ = -(uint)(auVar134._4_4_ < -0x7fffff01);
            auVar189._8_4_ = -(uint)(auVar134._8_4_ < -0x7fffff01);
            auVar189._12_4_ = -(uint)(auVar134._12_4_ < -0x7fffff01);
            auVar134 = ~auVar189 & auVar132 | auVar182 & auVar189;
            sVar71 = auVar118._0_2_;
            cVar11 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[0] - (0xff < sVar71);
            sVar71 = auVar118._2_2_;
            sVar51 = CONCAT11((0 < sVar71) * (sVar71 < 0x100) * auVar118[2] - (0xff < sVar71),cVar11
                             );
            sVar71 = auVar118._4_2_;
            cVar111 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[4] - (0xff < sVar71);
            sVar71 = auVar118._6_2_;
            uVar152 = CONCAT13((0 < sVar71) * (sVar71 < 0x100) * auVar118[6] - (0xff < sVar71),
                               CONCAT12(cVar111,sVar51));
            sVar71 = auVar118._8_2_;
            cVar12 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[8] - (0xff < sVar71);
            sVar71 = auVar118._10_2_;
            uVar153 = CONCAT15((0 < sVar71) * (sVar71 < 0x100) * auVar118[10] - (0xff < sVar71),
                               CONCAT14(cVar12,uVar152));
            sVar71 = auVar118._12_2_;
            cVar13 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[0xc] - (0xff < sVar71);
            sVar71 = auVar118._14_2_;
            uVar154 = CONCAT17((0 < sVar71) * (sVar71 < 0x100) * auVar118[0xe] - (0xff < sVar71),
                               CONCAT16(cVar13,uVar153));
            sVar71 = auVar134._0_2_;
            cVar14 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[0] - (0xff < sVar71);
            sVar71 = auVar134._2_2_;
            auVar155._0_10_ =
                 CONCAT19((0 < sVar71) * (sVar71 < 0x100) * auVar134[2] - (0xff < sVar71),
                          CONCAT18(cVar14,uVar154));
            sVar71 = auVar134._4_2_;
            cVar15 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[4] - (0xff < sVar71);
            auVar155[10] = cVar15;
            sVar71 = auVar134._6_2_;
            auVar155[0xb] = (0 < sVar71) * (sVar71 < 0x100) * auVar134[6] - (0xff < sVar71);
            sVar71 = auVar134._8_2_;
            cVar114 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[8] - (0xff < sVar71);
            auVar156[0xc] = cVar114;
            auVar156._0_12_ = auVar155;
            sVar71 = auVar134._10_2_;
            auVar156[0xd] = (0 < sVar71) * (sVar71 < 0x100) * auVar134[10] - (0xff < sVar71);
            sVar71 = auVar134._12_2_;
            cVar112 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[0xc] - (0xff < sVar71);
            auVar158[0xe] = cVar112;
            auVar158._0_14_ = auVar156;
            sVar71 = auVar134._14_2_;
            auVar158[0xf] = (0 < sVar71) * (sVar71 < 0x100) * auVar134[0xe] - (0xff < sVar71);
            auVar118 = auVar146 ^ _DAT_0022f730;
            auVar183._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar183._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar183._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar183._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar134 = ~auVar183 & auVar132 | auVar146 & auVar183;
            auVar118 = auVar138 ^ _DAT_0022f730;
            auVar169._0_4_ = -(uint)(auVar118._0_4_ < -0x7fffff01);
            auVar169._4_4_ = -(uint)(auVar118._4_4_ < -0x7fffff01);
            auVar169._8_4_ = -(uint)(auVar118._8_4_ < -0x7fffff01);
            auVar169._12_4_ = -(uint)(auVar118._12_4_ < -0x7fffff01);
            auVar118 = ~auVar169 & auVar132 | auVar138 & auVar169;
            sVar71 = auVar134._0_2_;
            cVar16 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[0] - (0xff < sVar71);
            sVar71 = auVar134._2_2_;
            sVar115 = CONCAT11((0 < sVar71) * (sVar71 < 0x100) * auVar134[2] - (0xff < sVar71),
                               cVar16);
            sVar71 = auVar134._4_2_;
            cVar17 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[4] - (0xff < sVar71);
            sVar71 = auVar134._6_2_;
            uVar176 = CONCAT13((0 < sVar71) * (sVar71 < 0x100) * auVar134[6] - (0xff < sVar71),
                               CONCAT12(cVar17,sVar115));
            sVar71 = auVar134._8_2_;
            cVar18 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[8] - (0xff < sVar71);
            sVar71 = auVar134._10_2_;
            uVar177 = CONCAT15((0 < sVar71) * (sVar71 < 0x100) * auVar134[10] - (0xff < sVar71),
                               CONCAT14(cVar18,uVar176));
            sVar71 = auVar134._12_2_;
            cVar19 = (0 < sVar71) * (sVar71 < 0x100) * auVar134[0xc] - (0xff < sVar71);
            sVar71 = auVar134._14_2_;
            uVar178 = CONCAT17((0 < sVar71) * (sVar71 < 0x100) * auVar134[0xe] - (0xff < sVar71),
                               CONCAT16(cVar19,uVar177));
            sVar71 = auVar118._0_2_;
            cVar20 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[0] - (0xff < sVar71);
            sVar71 = auVar118._2_2_;
            auVar179._0_10_ =
                 CONCAT19((0 < sVar71) * (sVar71 < 0x100) * auVar118[2] - (0xff < sVar71),
                          CONCAT18(cVar20,uVar178));
            sVar71 = auVar118._4_2_;
            cVar21 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[4] - (0xff < sVar71);
            auVar179[10] = cVar21;
            sVar71 = auVar118._6_2_;
            auVar179[0xb] = (0 < sVar71) * (sVar71 < 0x100) * auVar118[6] - (0xff < sVar71);
            sVar71 = auVar118._8_2_;
            cVar22 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[8] - (0xff < sVar71);
            auVar180[0xc] = cVar22;
            auVar180._0_12_ = auVar179;
            sVar71 = auVar118._10_2_;
            auVar180[0xd] = (0 < sVar71) * (sVar71 < 0x100) * auVar118[10] - (0xff < sVar71);
            sVar71 = auVar118._12_2_;
            cVar23 = (0 < sVar71) * (sVar71 < 0x100) * auVar118[0xc] - (0xff < sVar71);
            auVar184[0xe] = cVar23;
            auVar184._0_14_ = auVar180;
            sVar71 = auVar118._14_2_;
            auVar184[0xf] = (0 < sVar71) * (sVar71 < 0x100) * auVar118[0xe] - (0xff < sVar71);
            sVar71 = (short)((uint)uVar176 >> 0x10);
            auVar185[1] = (0 < sVar71) * (sVar71 < 0x100) * cVar17 - (0xff < sVar71);
            auVar185[0] = (0 < sVar115) * (sVar115 < 0x100) * cVar16 - (0xff < sVar115);
            sVar71 = (short)((uint6)uVar177 >> 0x20);
            auVar185[2] = (0 < sVar71) * (sVar71 < 0x100) * cVar18 - (0xff < sVar71);
            sVar71 = (short)((ulong)uVar178 >> 0x30);
            auVar185[3] = (0 < sVar71) * (sVar71 < 0x100) * cVar19 - (0xff < sVar71);
            sVar71 = (short)((unkuint10)auVar179._0_10_ >> 0x40);
            auVar185[4] = (0 < sVar71) * (sVar71 < 0x100) * cVar20 - (0xff < sVar71);
            sVar71 = auVar179._10_2_;
            auVar185[5] = (0 < sVar71) * (sVar71 < 0x100) * cVar21 - (0xff < sVar71);
            sVar71 = auVar180._12_2_;
            auVar185[6] = (0 < sVar71) * (sVar71 < 0x100) * cVar22 - (0xff < sVar71);
            sVar71 = auVar184._14_2_;
            auVar185[7] = (0 < sVar71) * (sVar71 < 0x100) * cVar23 - (0xff < sVar71);
            auVar185[8] = (0 < sVar51) * (sVar51 < 0x100) * cVar11 - (0xff < sVar51);
            sVar71 = (short)((uint)uVar152 >> 0x10);
            auVar185[9] = (0 < sVar71) * (sVar71 < 0x100) * cVar111 - (0xff < sVar71);
            sVar71 = (short)((uint6)uVar153 >> 0x20);
            auVar185[10] = (0 < sVar71) * (sVar71 < 0x100) * cVar12 - (0xff < sVar71);
            sVar71 = (short)((ulong)uVar154 >> 0x30);
            auVar185[0xb] = (0 < sVar71) * (sVar71 < 0x100) * cVar13 - (0xff < sVar71);
            sVar71 = (short)((unkuint10)auVar155._0_10_ >> 0x40);
            auVar185[0xc] = (0 < sVar71) * (sVar71 < 0x100) * cVar14 - (0xff < sVar71);
            sVar71 = auVar155._10_2_;
            auVar185[0xd] = (0 < sVar71) * (sVar71 < 0x100) * cVar15 - (0xff < sVar71);
            sVar71 = auVar156._12_2_;
            auVar185[0xe] = (0 < sVar71) * (sVar71 < 0x100) * cVar114 - (0xff < sVar71);
            sVar71 = auVar158._14_2_;
            auVar185[0xf] = (0 < sVar71) * (sVar71 < 0x100) * cVar112 - (0xff < sVar71);
            *(undefined1 (*) [16])((long)&local_238[0].data + lVar98) = auVar185;
            lVar98 = lVar98 + 0x10;
            iVar80 = (int)DAT_002a98f0;
            auVar120._0_4_ = auVar120._0_4_ + iVar80;
            iVar92 = DAT_002a98f0._4_4_;
            auVar120._4_4_ = uVar72 + iVar92;
            iVar60 = DAT_002a98f0._8_4_;
            auVar120._8_4_ = uVar73 + iVar60;
            iVar61 = DAT_002a98f0._12_4_;
            auVar120._12_4_ = uVar149 + iVar61;
            auVar127._0_4_ = auVar127._0_4_ + iVar80;
            auVar127._4_4_ = uVar59 + iVar92;
            auVar127._8_4_ = uVar95 + iVar60;
            auVar127._12_4_ = uVar97 + iVar61;
            auVar131._0_4_ = auVar131._0_4_ + iVar80;
            auVar131._4_4_ = uVar170 + iVar92;
            auVar131._8_4_ = uVar172 + iVar60;
            auVar131._12_4_ = uVar174 + iVar61;
            auVar133._0_4_ = auVar133._0_4_ + iVar80;
            auVar133._4_4_ = uVar159 + iVar92;
            auVar133._8_4_ = uVar161 + iVar60;
            auVar133._12_4_ = uVar163 + iVar61;
            auVar118 = _DAT_002a98c0;
          } while (lVar98 != 0x100);
          iVar80 = psVar100[1].cff.cursor;
          auVar134 = _DAT_0022f730;
          auVar118 = _DAT_002a98c0;
          if (0 < iVar80) {
            lVar78._0_4_ = psVar100[1].hmtx;
            lVar78._4_4_ = psVar100[1].kern;
            iVar92 = 0;
            do {
              if ((*(int *)(lVar78 + 0xc) != 0) && (*(ushort *)(lVar78 + 6) != 0)) {
                iVar80 = *(int *)(local_4a8._8_8_ + 0x28);
                uVar49 = *(ushort *)(lVar78 + 4);
                puVar65 = *(uchar **)(local_4a8._8_8_ + 0x18) +
                          (ulong)*(ushort *)(lVar78 + 10) * (long)iVar80 +
                          (ulong)*(ushort *)(lVar78 + 8);
                uVar59 = (uint)*(ushort *)(lVar78 + 6);
                do {
                  if ((ulong)uVar49 != 0) {
                    uVar81 = 0;
                    do {
                      puVar65[uVar81] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar65[uVar81]);
                      uVar81 = uVar81 + 1;
                    } while (uVar49 != uVar81);
                  }
                  puVar65 = puVar65 + iVar80;
                  bVar102 = 1 < (int)uVar59;
                  uVar59 = uVar59 - 1;
                } while (bVar102);
                iVar80 = psVar100[1].cff.cursor;
              }
              iVar92 = iVar92 + 1;
              lVar78 = lVar78 + 0x10;
            } while (iVar92 < iVar80);
          }
        }
        psVar100[1].hmtx = 0;
        psVar100[1].kern = 0;
        atlas_00 = (ImFontAtlas *)local_4a8._8_8_;
      }
      lVar98 = local_338 + 1;
    } while (lVar98 < (int)local_408);
  }
  ImGui::MemFree(local_300);
  ImGui::MemFree(local_340);
  pvVar66 = pvStack_410;
  if (pvStack_410 != (void *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pvStack_410;
    _local_418 = (stbtt__buf)(auVar42 << 0x40);
    ImGui::MemFree(pvVar66);
    pvStack_410._0_4_ = 0;
    pvStack_410._4_4_ = 0;
  }
  iVar80 = (int)local_408;
  uVar81 = (ulong)(int)local_408;
  if (0 < (long)uVar81) {
    local_488._0_8_ = pvStack_400;
    uVar77 = 0;
    auVar110._0_12_ = DAT_002a9900._0_12_;
    auVar110._12_2_ = DAT_002a9900._6_2_;
    auVar110._14_2_ = DAT_002a9900._6_2_;
    auVar109._12_4_ = auVar110._12_4_;
    auVar109._0_10_ = (unkbyte10)DAT_002a9900;
    auVar109._10_2_ = DAT_002a9900._4_2_;
    auVar108._10_6_ = auVar109._10_6_;
    auVar108._0_8_ = (undefined8)DAT_002a9900;
    auVar108._8_2_ = DAT_002a9900._4_2_;
    local_458._8_8_ = auVar108._8_8_;
    local_458._6_2_ = DAT_002a9900._2_2_;
    local_458._4_2_ = DAT_002a9900._2_2_;
    local_458._0_2_ = (undefined2)DAT_002a9900;
    local_458._2_2_ = local_458._0_2_;
    do {
      iVar92 = *(int *)(local_488._0_8_ + 0xe8 + uVar77 * 0x110);
      if (iVar92 != 0) {
        lVar98 = uVar77 * 0x110 + local_488._0_8_;
        pIVar9 = ((ImVector<ImFontConfig> *)(local_4a8._8_8_ + 0x60))->Data;
        pIVar99 = pIVar9 + uVar77;
        pIVar8 = pIVar9[uVar77].DstFont;
        if (pIVar9[uVar77].MergeMode == true) {
          uVar7 = pIVar8->ConfigDataCount;
          sVar71 = uVar7 + 1;
          fVar117 = pIVar8->Ascent;
        }
        else {
          fVar96 = pIVar9[uVar77].SizePixels;
          lVar83 = *(long *)(lVar98 + 8);
          lVar78 = (long)*(int *)(lVar98 + 0x24);
          uVar59 = (uint)*(byte *)(lVar83 + 4 + lVar78);
          bVar103 = *(byte *)(lVar83 + 5 + lVar78);
          bVar4 = *(byte *)(lVar83 + 7 + lVar78);
          bVar5 = *(byte *)(lVar83 + 6 + lVar78);
          ImFont::ClearOutputData(pIVar8);
          iVar92 = (uint)bVar5 * 0x100 + uVar59;
          auVar30._1_9_ = (unkuint9)(byte)((uint)iVar92 >> 0x18) << 8;
          auVar30[0] = (char)((uint)iVar92 >> 0x10);
          auVar30._10_6_ = 0;
          auVar46._1_12_ = SUB1612(auVar30 << 0x28,4);
          auVar46[0] = (char)((uint)iVar92 >> 8);
          auVar46[0xd] = 0;
          auVar47._1_14_ = auVar46 << 8;
          auVar47[0] = (char)iVar92;
          auVar47[0xf] = 0;
          auVar118 = ZEXT416((uint)bVar103 | (uint)bVar4 << 0x10) | auVar47 << 8;
          sVar51 = auVar118._0_2_;
          sVar71 = auVar118._2_2_;
          auVar121._0_4_ = (float)((int)sVar51 - (int)sVar71);
          fVar96 = fVar96 / auVar121._0_4_;
          sVar116 = auVar118._6_2_;
          auVar124._0_14_ = ZEXT414((uint)auVar121._0_4_);
          auVar124._14_2_ = sVar116;
          sVar115 = auVar118._4_2_;
          auVar123._12_4_ = auVar124._12_4_;
          auVar123._4_6_ = 0;
          auVar123._0_4_ = auVar121._0_4_;
          auVar123._10_2_ = sVar115;
          auVar122._10_6_ = auVar123._10_6_;
          auVar122._4_6_ = 0;
          auVar122._0_4_ = auVar121._0_4_;
          auVar121._8_8_ = auVar122._8_8_;
          auVar121._6_2_ = sVar71;
          auVar121._4_2_ = (short)((uint)auVar121._0_4_ >> 0x10);
          auVar128._0_2_ = -(ushort)(sVar51 < (short)local_458._0_2_);
          auVar128._2_2_ = -(ushort)(sVar51 < (short)local_458._2_2_);
          auVar128._4_2_ = -(ushort)(sVar71 < (short)local_458._4_2_);
          auVar128._6_2_ = -(ushort)(sVar71 < (short)local_458._6_2_);
          auVar128._8_2_ = -(ushort)(sVar115 < (short)local_458._8_2_);
          auVar128._10_2_ = -(ushort)(sVar115 < (short)local_458._10_2_);
          auVar128._12_2_ = -(ushort)(sVar116 < (short)local_458._12_2_);
          auVar128._14_2_ = -(ushort)(sVar116 < (short)local_458._14_2_);
          auVar118 = auVar128 & _DAT_00245cc0 | ~auVar128 & _DAT_00245cd0;
          fVar117 = (float)(int)(fVar96 * (float)(int)sVar51 + auVar118._0_4_);
          pIVar8->FontSize = pIVar99->SizePixels;
          pIVar8->ConfigData = pIVar99;
          pIVar8->ContainerAtlas = (ImFontAtlas *)local_4a8._8_8_;
          pIVar8->Ascent = fVar117;
          pIVar8->Descent = (float)(int)(fVar96 * (float)(auVar121._4_4_ >> 0x10) + auVar118._4_4_);
          iVar92 = *(int *)(lVar98 + 0xe8);
          sVar71 = 1;
        }
        pIVar8->ConfigDataCount = sVar71;
        if (0 < iVar92) {
          fVar96 = (pIVar99->GlyphOffset).x;
          fVar117 = (float)(int)(fVar117 + 0.5) + (pIVar99->GlyphOffset).y;
          lVar78 = 0;
          lVar83 = 0;
          do {
            lVar76 = *(long *)(lVar98 + 0xd0);
            fVar140 = 1.0 / (float)*(int *)(local_4a8._8_8_ + 0x2c);
            fVar139 = 1.0 / (float)*(int *)(local_4a8._8_8_ + 0x28);
            ImFont::AddGlyph(pIVar8,pIVar99,*(ImWchar *)(*(long *)(lVar98 + 0x108) + lVar83 * 4),
                             *(float *)(lVar76 + 8 + lVar78) + 0.0 + fVar96,
                             *(float *)(lVar76 + 0xc + lVar78) + 0.0 + fVar117,
                             *(float *)(lVar76 + 0x14 + lVar78) + 0.0 + fVar96,
                             *(float *)(lVar76 + 0x18 + lVar78) + 0.0 + fVar117,
                             (float)*(ushort *)(lVar76 + lVar78) * fVar139,
                             (float)*(ushort *)(lVar76 + 2 + lVar78) * fVar140,
                             (float)*(ushort *)(lVar76 + 4 + lVar78) * fVar139,
                             (float)*(ushort *)(lVar76 + 6 + lVar78) * fVar140,
                             *(float *)(lVar76 + 0x10 + lVar78));
            lVar83 = lVar83 + 1;
            lVar78 = lVar78 + 0x1c;
          } while (lVar83 < *(int *)(lVar98 + 0xe8));
        }
      }
      atlas_00 = (ImFontAtlas *)local_4a8._8_8_;
      uVar77 = uVar77 + 1;
    } while (uVar77 < uVar81);
    if (0 < iVar80) {
      puVar82 = (undefined8 *)((long)pvStack_400 + 0x108);
      uVar77 = 0;
      do {
        if ((void *)*puVar82 != (void *)0x0) {
          ImGui::MemFree((void *)*puVar82);
        }
        if ((void *)puVar82[-2] != (void *)0x0) {
          ImGui::MemFree((void *)puVar82[-2]);
        }
        uVar77 = uVar77 + 1;
        puVar82 = puVar82 + 0x22;
      } while (uVar77 < uVar81);
    }
  }
  ImFontAtlasBuildFinish(atlas_00);
  if (pIStack_3a0 != (ImFontConfig *)0x0) {
    ImGui::MemFree(pIStack_3a0);
  }
  bVar102 = true;
LAB_001f2da0:
  if (pvStack_3d0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3d0);
  }
  if (pvStack_400 != (void *)0x0) {
    ImGui::MemFree(pvStack_400);
  }
  return bVar102;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}